

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

char * duckdb_yyjson::yyjson_mut_write_opts_impl
                 (yyjson_mut_val *val,usize estimated_val_num,yyjson_write_flag flg,
                 yyjson_alc *alc_ptr,usize *dat_len,yyjson_write_err *err)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  _func_void_ptr_void_ptr_size_t *p_Var4;
  _func_void_void_ptr_void_ptr *p_Var5;
  void *pvVar6;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  long lVar57;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  uint64_t uVar58;
  uint *puVar59;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  char *pcVar60;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  int iVar61;
  long lVar62;
  size_t sVar63;
  ulong uVar64;
  yyjson_write_err *pyVar65;
  yyjson_write_err *pyVar66;
  undefined2 uVar67;
  uint uVar68;
  int iVar69;
  undefined8 *puVar70;
  undefined8 uVar71;
  size_t sVar72;
  ulong uVar73;
  uint *puVar74;
  ulong uVar75;
  uint uVar76;
  ulong uVar77;
  long lVar78;
  byte *pbVar79;
  ulong uVar80;
  int iVar81;
  uint uVar82;
  int iVar83;
  yyjson_mut_val *pyVar84;
  yyjson_mut_val *pyVar85;
  uint *puVar86;
  undefined2 *puVar87;
  ulong *puVar88;
  ulong *puVar89;
  int iVar90;
  uint uVar91;
  long lVar92;
  ulong uVar93;
  ulong uVar94;
  uint uVar95;
  undefined **ppuVar96;
  ulong uVar97;
  undefined1 *puVar98;
  long lVar99;
  byte *pbVar100;
  byte bVar101;
  undefined1 *puVar102;
  uint *puVar103;
  ulong uVar104;
  uint *puVar105;
  uint *puVar106;
  size_t sVar107;
  bool bVar108;
  bool bVar109;
  yyjson_write_err dummy_err;
  byte *local_f8;
  char local_ec;
  ulong local_e0;
  uint local_c0;
  uint *local_90;
  ulong *local_88;
  yyjson_mut_val *local_80;
  uint *local_70;
  uint *local_58;
  yyjson_write_err local_48;
  long local_38;
  
  ppuVar96 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar96 = &alc_ptr->malloc;
  }
  pyVar66 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar66 = &local_48;
  }
  if (val != (yyjson_mut_val *)0x0) {
    p_Var4 = ((yyjson_alc *)ppuVar96)->malloc;
    p_Var5 = ((yyjson_alc *)ppuVar96)->free;
    pvVar6 = ((yyjson_alc *)ppuVar96)->ctx;
    uVar77 = val->tag;
    bVar101 = (byte)uVar77;
    local_ec = (char)flg;
    if (0xff < uVar77 && (~bVar101 & 6) == 0) {
      p_Var7 = ((yyjson_alc *)ppuVar96)->realloc;
      if ((flg & 0x41) == 0) {
        if ((flg & 2) == 0) {
          puVar98 = enc_table_cpy;
          puVar102 = enc_table_cpy_slash;
        }
        else {
          puVar98 = enc_table_esc;
          puVar102 = enc_table_esc_slash;
        }
        if ((flg & 4) == 0) {
          puVar102 = puVar98;
        }
        sVar107 = estimated_val_num * 0x12 + 0x4f & 0xfffffffffffffff0;
        local_f8 = (byte *)(*p_Var4)(pvVar6,sVar107);
        if (local_f8 != (byte *)0x0) {
          uVar68 = (uint)val->tag & 7;
          bVar109 = uVar68 == 7;
          local_e0 = (ulong)bVar109;
          lVar92 = (val->tag >> 8) << bVar109;
          *local_f8 = bVar109 << 5 | 0x5b;
          local_80 = (yyjson_mut_val *)(val->uni).u64;
          if (uVar68 == 7) {
            local_80 = local_80->next;
          }
          puVar105 = (uint *)(local_f8 + sVar107);
          puVar103 = (uint *)(local_f8 + 1);
          local_90 = puVar105;
LAB_0126b134:
          uVar77 = local_e0 & 0xff;
          puVar86 = puVar105;
          pyVar84 = local_80;
          puVar74 = puVar103;
LAB_0126b153:
          pyVar84 = pyVar84->next;
          uVar94 = pyVar84->tag;
          bVar101 = (byte)uVar94 & 7;
          if (bVar101 == 4) {
            if (puVar86 <= puVar74 + 8) {
              uVar94 = sVar107 >> 1;
              if (uVar94 < 0x21) {
                uVar94 = 0x20;
              }
              sVar63 = (uVar94 + 0xf & 0xfffffffffffffff0) + sVar107;
              pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,sVar63);
              if (pbVar79 == (byte *)0x0) goto LAB_0126d569;
              sVar72 = (long)local_90 - (long)puVar86;
              memmove(pbVar79 + (sVar63 - sVar72),pbVar79 + ((long)puVar86 - (long)local_f8),sVar72)
              ;
              puVar74 = (uint *)(pbVar79 + ((long)puVar74 - (long)local_f8));
              local_90 = (uint *)(pbVar79 + sVar63);
              sVar107 = sVar63;
              puVar86 = (uint *)(pbVar79 + (sVar63 - sVar72));
              local_f8 = pbVar79;
            }
            uVar94 = (pyVar84->uni).u64;
            uVar68 = (uint)(uVar94 >> 0x20);
            if ((pyVar84->tag & 0x10) == 0) {
              uVar68 = uVar68 >> 0x1f & (uint)(pyVar84->tag >> 3);
              *(byte *)puVar74 = 0x2d;
              uVar75 = -uVar94;
              if (uVar68 == 0) {
                uVar75 = uVar94;
              }
              pbVar79 = (byte *)((ulong)uVar68 + (long)puVar74);
              if (uVar75 < 100000000) {
                if (uVar75 < 100) {
                  *(undefined2 *)pbVar79 =
                       *(undefined2 *)(digit_table + (ulong)(uVar75 < 10) + uVar75 * 2);
                  puVar74 = (uint *)(pbVar79 + (2 - (ulong)(uVar75 < 10)));
                }
                else {
                  iVar69 = (int)uVar75;
                  if (uVar75 < 10000) {
                    uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar94 = (ulong)(uVar75 < 1000);
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + uVar94 + (ulong)uVar68 * 2);
                    *(undefined2 *)(pbVar79 + (2 - uVar94)) =
                         *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                    puVar74 = (uint *)(pbVar79 + (4 - uVar94));
                  }
                  else if (uVar75 < 1000000) {
                    iVar69 = (int)(uVar75 * 0x68db9 >> 0x20) * -10000 + iVar69;
                    uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar94 = (ulong)(uVar75 < 100000);
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + uVar94 + (uVar75 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar79 + (2 - uVar94)) =
                         *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                    *(undefined2 *)(pbVar79 + (4 - uVar94)) =
                         *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                    puVar74 = (uint *)(pbVar79 + (6 - uVar94));
                  }
                  else {
                    uVar68 = (uint)(uVar75 * 0x68db8bb >> 0x20);
                    uVar76 = uVar68 >> 8;
                    iVar69 = uVar76 * -10000 + iVar69;
                    uVar76 = uVar76 * 0x147b >> 0x13;
                    uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar94 = (ulong)(uVar75 < 10000000);
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + uVar94 + (ulong)uVar76 * 2);
                    *(undefined2 *)(pbVar79 + (2 - uVar94)) =
                         *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                    *(undefined2 *)(pbVar79 + (4 - uVar94)) =
                         *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                    *(undefined2 *)(pbVar79 + (6 - uVar94)) =
                         *(undefined2 *)(digit_table + (uVar82 * -100 + iVar69) * 2);
                    puVar74 = (uint *)(pbVar79 + (8 - uVar94));
                  }
                }
              }
              else {
                uVar94 = uVar75 / 100000000;
                uVar64 = uVar94 * 0xfa0a1f00 + uVar75;
                iVar69 = (int)uVar94;
                if (uVar75 < 10000000000000000) {
                  if (uVar75 < 10000000000) {
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + (ulong)(uVar75 < 1000000000) + uVar94 * 2);
                    pbVar79 = pbVar79 + (2 - (ulong)(uVar75 < 1000000000));
                  }
                  else if (uVar75 < 1000000000000) {
                    uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar94 = (ulong)(uVar75 < 100000000000);
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + uVar94 + (ulong)uVar68 * 2);
                    *(undefined2 *)(pbVar79 + (2 - uVar94)) =
                         *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                    pbVar79 = pbVar79 + (4 - uVar94);
                  }
                  else if (uVar75 < 100000000000000) {
                    iVar69 = (int)(uVar94 * 0x68db9 >> 0x20) * -10000 + iVar69;
                    uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar75 = (ulong)(uVar75 < 10000000000000);
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + uVar75 + (uVar94 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar79 + (2 - uVar75)) =
                         *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                    *(undefined2 *)(pbVar79 + (4 - uVar75)) =
                         *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                    pbVar79 = pbVar79 + (6 - uVar75);
                  }
                  else {
                    uVar68 = (uint)(uVar94 * 0x68db8bb >> 0x20);
                    uVar76 = uVar68 >> 8;
                    iVar69 = uVar76 * -10000 + iVar69;
                    uVar76 = uVar76 * 0x147b >> 0x13;
                    uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar94 = (ulong)(uVar75 < 1000000000000000);
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + uVar94 + (ulong)uVar76 * 2);
                    *(undefined2 *)(pbVar79 + (2 - uVar94)) =
                         *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                    *(undefined2 *)(pbVar79 + (4 - uVar94)) =
                         *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                    *(undefined2 *)(pbVar79 + (6 - uVar94)) =
                         *(undefined2 *)(digit_table + (uVar82 * -100 + iVar69) * 2);
                    pbVar79 = pbVar79 + (8 - uVar94);
                  }
                  uVar68 = (uint)((uVar64 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar76 = uVar68 >> 8;
                  iVar69 = uVar76 * -10000 + (int)uVar64;
                  uVar76 = uVar76 * 0x147b >> 0x13;
                  uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                  *(undefined2 *)(pbVar79 + 2) =
                       *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                  *(undefined2 *)(pbVar79 + 4) = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                  *(undefined2 *)(pbVar79 + 6) =
                       *(undefined2 *)(digit_table + (uVar82 * 0x7fffff9c + iVar69) * 2);
                  puVar74 = (uint *)(pbVar79 + 8);
                }
                else {
                  uVar94 = uVar75 / 1000000000000;
                  iVar61 = (int)uVar94;
                  if (uVar75 < 1000000000000000000) {
                    iVar90 = (int)(uVar94 * 0x68db9 >> 0x20) * -10000 + iVar61;
                    uVar68 = (uint)(iVar90 * 0x147b) >> 0x13;
                    uVar75 = (ulong)(uVar75 < 100000000000000000);
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + uVar75 + (uVar94 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar79 + (2 - uVar75)) =
                         *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                    *(undefined2 *)(pbVar79 + (4 - uVar75)) =
                         *(undefined2 *)(digit_table + (uVar68 * -100 + iVar90) * 2);
                    lVar99 = 6 - uVar75;
                  }
                  else {
                    uVar68 = (uint)(uVar94 / 10000);
                    iVar90 = uVar68 * -10000 + iVar61;
                    uVar68 = uVar68 / 100;
                    uVar76 = (uint)(iVar90 * 0x147b) >> 0x13;
                    uVar75 = (ulong)(uVar75 < 10000000000000000000);
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + uVar75 + (ulong)uVar68 * 2);
                    *(undefined2 *)(pbVar79 + (2 - uVar75)) =
                         *(undefined2 *)(digit_table + (uVar68 * -100 + (int)(uVar94 / 10000)) * 2);
                    *(undefined2 *)(pbVar79 + (4 - uVar75)) =
                         *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                    *(undefined2 *)(pbVar79 + (6 - uVar75)) =
                         *(undefined2 *)(digit_table + (uVar76 * -100 + iVar90) * 2);
                    lVar99 = 8 - uVar75;
                  }
                  pbVar79 = pbVar79 + lVar99;
                  iVar69 = iVar69 + iVar61 * -10000;
                  uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                  *(undefined2 *)(pbVar79 + 2) =
                       *(undefined2 *)(digit_table + (uVar68 * 0x7fffff9c + iVar69) * 2);
                  uVar68 = (uint)((uVar64 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar76 = uVar68 >> 8;
                  iVar69 = uVar76 * -10000 + (int)uVar64;
                  uVar76 = uVar76 * 0x147b >> 0x13;
                  uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                  *(undefined2 *)(pbVar79 + 4) = *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                  *(undefined2 *)(pbVar79 + 6) =
                       *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                  *(undefined2 *)(pbVar79 + 8) = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                  *(undefined2 *)(pbVar79 + 10) =
                       *(undefined2 *)(digit_table + (uVar82 * 0x7fffff9c + iVar69) * 2);
                  puVar74 = (uint *)(pbVar79 + 0xc);
                }
              }
            }
            else {
              uVar75 = uVar94 & 0xfffffffffffff;
              uVar68 = uVar68 >> 0x14 & 0x7ff;
              if (uVar68 == 0x7ff) {
                if ((flg & 0x10) == 0) {
                  if ((flg & 8) == 0) {
                    puVar74 = (uint *)0x0;
                  }
                  else if (uVar75 == 0) {
                    *(byte *)puVar74 = 0x2d;
                    puVar70 = (undefined8 *)((long)puVar74 - ((long)uVar94 >> 0x3f));
                    *puVar70 = 0x7974696e69666e49;
                    puVar74 = (uint *)(puVar70 + 1);
                  }
                  else {
                    *puVar74 = 0x4e614e;
                    puVar74 = (uint *)((long)puVar74 + 3);
                  }
                }
                else {
                  *puVar74 = 0x6c6c756e;
                  puVar74 = puVar74 + 1;
                }
              }
              else {
                *(byte *)puVar74 = 0x2d;
                lVar99 = -((long)uVar94 >> 0x3f);
                puVar70 = (undefined8 *)((long)puVar74 + lVar99);
                if ((uVar94 & 0x7fffffffffffffff) == 0) {
                  *(undefined4 *)puVar70 = 0x302e30;
                  puVar74 = (uint *)((long)puVar70 + 3);
                }
                else if (uVar68 == 0) {
                  yyjson_mut_write_opts_impl();
                  puVar74 = local_70;
                }
                else {
                  uVar64 = uVar75 + 0x10000000000000;
                  if (uVar68 - 0x3ff < 0x35) {
                    lVar78 = 0;
                    if (uVar64 != 0) {
                      for (; (uVar64 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
                      }
                    }
                    if (0x433 - uVar68 <= (uint)lVar78) {
                      uVar64 = uVar64 >> ((byte)(0x433 - uVar68) & 0x3f);
                      if (uVar64 < 100000000) {
                        if (uVar64 < 100) {
                          *(undefined2 *)puVar70 =
                               *(undefined2 *)(digit_table + (ulong)(uVar64 < 10) + uVar64 * 2);
                          puVar87 = (undefined2 *)((long)puVar70 + (2 - (ulong)(uVar64 < 10)));
                        }
                        else {
                          iVar69 = (int)uVar64;
                          if (uVar64 < 10000) {
                            uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                            uVar94 = (ulong)(uVar64 < 1000);
                            *(undefined2 *)puVar70 =
                                 *(undefined2 *)(digit_table + uVar94 + (ulong)uVar68 * 2);
                            *(undefined2 *)((long)puVar70 + (2 - uVar94)) =
                                 *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                            puVar87 = (undefined2 *)((long)puVar70 + (4 - uVar94));
                          }
                          else if (uVar64 < 1000000) {
                            iVar69 = (int)(uVar64 * 0x68db9 >> 0x20) * -10000 + iVar69;
                            uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                            uVar94 = (ulong)(uVar64 < 100000);
                            *(undefined2 *)puVar70 =
                                 *(undefined2 *)
                                  (digit_table + uVar94 + (uVar64 * 0x68db9 >> 0x20) * 2);
                            *(undefined2 *)((long)puVar70 + (2 - uVar94)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                            *(undefined2 *)((long)puVar70 + (4 - uVar94)) =
                                 *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                            puVar87 = (undefined2 *)((long)puVar70 + (6 - uVar94));
                          }
                          else {
                            uVar68 = (uint)(uVar64 * 0x68db8bb >> 0x20);
                            uVar76 = uVar68 >> 8;
                            iVar69 = uVar76 * -10000 + iVar69;
                            uVar76 = uVar76 * 0x147b >> 0x13;
                            uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                            uVar94 = (ulong)(uVar64 < 10000000);
                            *(undefined2 *)puVar70 =
                                 *(undefined2 *)(digit_table + uVar94 + (ulong)uVar76 * 2);
                            *(undefined2 *)((long)puVar70 + (2 - uVar94)) =
                                 *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                            *(undefined2 *)((long)puVar70 + (4 - uVar94)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                            *(undefined2 *)((long)puVar70 + (6 - uVar94)) =
                                 *(undefined2 *)(digit_table + (uVar82 * -100 + iVar69) * 2);
                            puVar87 = (undefined2 *)((long)puVar70 + (8 - uVar94));
                          }
                        }
                      }
                      else {
                        auVar22._8_8_ = 0;
                        auVar22._0_8_ = uVar64;
                        uVar94 = SUB168(auVar22 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                        if (uVar64 < 10000000000) {
                          *(undefined2 *)puVar70 =
                               *(undefined2 *)
                                (digit_table + (ulong)(uVar64 < 1000000000) + uVar94 * 2);
                          puVar87 = (undefined2 *)
                                    ((long)puVar70 + (2 - (ulong)(uVar64 < 1000000000)));
                        }
                        else {
                          iVar69 = (int)uVar94;
                          if (uVar64 < 1000000000000) {
                            uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                            uVar75 = (ulong)(uVar64 < 100000000000);
                            *(undefined2 *)puVar70 =
                                 *(undefined2 *)(digit_table + uVar75 + (ulong)uVar68 * 2);
                            *(undefined2 *)((long)puVar70 + (2 - uVar75)) =
                                 *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                            puVar87 = (undefined2 *)((long)puVar70 + (4 - uVar75));
                          }
                          else if (uVar64 < 100000000000000) {
                            iVar69 = (int)(uVar94 * 0x68db9 >> 0x20) * -10000 + iVar69;
                            uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                            uVar75 = (ulong)(uVar64 < 10000000000000);
                            *(undefined2 *)puVar70 =
                                 *(undefined2 *)
                                  (digit_table + uVar75 + (uVar94 * 0x68db9 >> 0x20) * 2);
                            *(undefined2 *)((long)puVar70 + (2 - uVar75)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                            *(undefined2 *)((long)puVar70 + (4 - uVar75)) =
                                 *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                            puVar87 = (undefined2 *)((long)puVar70 + (6 - uVar75));
                          }
                          else {
                            uVar68 = (uint)(uVar94 * 0x68db8bb >> 0x20);
                            uVar76 = uVar68 >> 8;
                            iVar69 = uVar76 * -10000 + iVar69;
                            uVar76 = uVar76 * 0x147b >> 0x13;
                            uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                            uVar75 = (ulong)(uVar64 < 1000000000000000);
                            *(undefined2 *)puVar70 =
                                 *(undefined2 *)(digit_table + uVar75 + (ulong)uVar76 * 2);
                            *(undefined2 *)((long)puVar70 + (2 - uVar75)) =
                                 *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                            *(undefined2 *)((long)puVar70 + (4 - uVar75)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                            *(undefined2 *)((long)puVar70 + (6 - uVar75)) =
                                 *(undefined2 *)(digit_table + (uVar82 * -100 + iVar69) * 2);
                            puVar87 = (undefined2 *)((long)puVar70 + (8 - uVar75));
                          }
                        }
                        uVar64 = uVar94 * 0xfa0a1f00 + uVar64;
                        uVar68 = (uint)((uVar64 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar76 = uVar68 >> 8;
                        iVar69 = uVar76 * -10000 + (int)uVar64;
                        uVar76 = uVar76 * 0x147b >> 0x13;
                        uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                        *puVar87 = *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                        puVar87[1] = *(undefined2 *)
                                      (digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                        puVar87[2] = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                        puVar87[3] = *(undefined2 *)
                                      (digit_table + (uVar82 * 0x7fffff9c + iVar69) * 2);
                        puVar87 = puVar87 + 4;
                      }
                      *puVar87 = 0x302e;
                      puVar74 = (uint *)(puVar87 + 1);
                      goto LAB_0126cb3c;
                    }
                  }
                  uVar94 = (ulong)((uint)uVar94 & 1);
                  iVar69 = uVar68 * 0x4d105 + -0x200a5;
                  if (uVar68 == 1 || uVar75 != 0) {
                    iVar69 = uVar68 * 0x4d105;
                  }
                  iVar69 = iVar69 + -0x1439b7ff >> 0x14;
                  uVar104 = *(ulong *)(pow10_sig_table + (ulong)(iVar69 * -2 + 0x2ae) * 8);
                  uVar80 = *(long *)(pow10_sig_table + (ulong)(iVar69 * -2 + 0x2af) * 8) +
                           (ulong)(iVar69 - 1U < 0xffffffc8);
                  bVar101 = ((char)((uint)(iVar69 * -0x3526b) >> 0x10) + (char)uVar68) - 0x32;
                  uVar75 = (ulong)(uVar68 != 1 && uVar75 == 0) + uVar64 * 4 + -2 << (bVar101 & 0x3f)
                  ;
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = uVar80;
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = uVar75;
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = SUB168(auVar16 * auVar36,8);
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = uVar104;
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = uVar75;
                  auVar51 = auVar17 * auVar37 + auVar51;
                  uVar75 = uVar64 * 4 << (bVar101 & 0x3f);
                  auVar18._8_8_ = 0;
                  auVar18._0_8_ = uVar80;
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = uVar75;
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = SUB168(auVar18 * auVar38,8);
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = uVar104;
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = uVar75;
                  auVar52 = auVar19 * auVar39 + auVar52;
                  uVar73 = auVar52._8_8_;
                  uVar75 = uVar64 * 4 + 2 << (bVar101 & 0x3f);
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = uVar80;
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = uVar75;
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = SUB168(auVar20 * auVar40,8);
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = uVar104;
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = uVar75;
                  auVar53 = auVar21 * auVar41 + auVar53;
                  uVar75 = ((ulong)((auVar51 & (undefined1  [16])0xfffffffffffffffe) !=
                                   (undefined1  [16])0x0) | auVar51._8_8_) + uVar94;
                  uVar94 = ((ulong)((auVar53 & (undefined1  [16])0xfffffffffffffffe) !=
                                   (undefined1  [16])0x0) | auVar53._8_8_) - uVar94;
                  if (uVar73 < 0x28) {
LAB_0126b536:
                    uVar104 = (auVar52 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0 | uVar73;
                    uVar64 = uVar73 & 0xfffffffffffffffc;
                    bVar109 = true;
                    if (uVar104 <= uVar64 + 2) {
                      bVar109 = (bool)((byte)((uVar73 & 0xffffffff) >> 2) & 0x3f &
                                      uVar104 == uVar64 + 2);
                    }
                    bVar108 = uVar64 + 4 <= uVar94;
                    if (uVar64 < uVar75 == bVar108) {
                      bVar109 = bVar108;
                    }
                    uVar94 = (ulong)bVar109 + (uVar73 >> 2);
                  }
                  else {
                    uVar104 = uVar73 / 0x28;
                    uVar64 = uVar104 * 0x28 + 0x28;
                    if (uVar104 * 0x28 < uVar75 != uVar64 <= uVar94) goto LAB_0126b536;
                    uVar94 = (uVar104 + 1) - (ulong)(uVar94 < uVar64);
                    iVar69 = iVar69 + 1;
                  }
                  iVar61 = (0x11 - (uint)(uVar94 < 10000000000000000)) -
                           (uint)(uVar94 < 1000000000000000);
                  if (iVar61 + iVar69 + 5U < 0x1b) {
                    uVar68 = iVar61 + iVar69;
                    if ((int)uVar68 < 1) {
                      uVar75 = uVar94 / 100000000;
                      uVar76 = (uint)uVar75;
                      puVar87 = (undefined2 *)
                                ((long)puVar70 +
                                (((ulong)(2 - uVar68) + 1) - (ulong)(uVar76 < 100000000)));
                      iVar90 = (int)((uVar75 & 0xffffffff) / 10000);
                      iVar61 = iVar90 * -10000 + uVar76;
                      uVar94 = uVar75 * 0xfa0a1f00 + uVar94;
                      iVar69 = (int)(((uVar75 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar95 = (uint)(iVar69 * 0x29) >> 0xc;
                      uVar91 = uVar95 * -100 + iVar69;
                      uVar82 = iVar69 * -100 + iVar90;
                      *(char *)((long)puVar70 + (ulong)(2 - uVar68)) = (char)uVar95 + '0';
                      uVar75 = (ulong)(uVar91 < 10 && uVar76 < 100000000);
                      *puVar87 = *(undefined2 *)(digit_table + uVar75 + uVar91 * 2);
                      *(undefined2 *)((long)puVar87 + (2 - uVar75)) =
                           *(undefined2 *)(digit_table + uVar82 * 2);
                      iVar69 = (int)uVar94;
                      if (iVar69 == 0) {
                        if (iVar61 == 0) {
                          uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar91];
                          if (uVar82 != 0) {
                            uVar94 = 0;
                          }
                          uVar94 = uVar94 + (byte)dec_trailing_zero_table[uVar82];
                          lVar99 = 4;
                        }
                        else {
                          uVar76 = (uint)(iVar61 * 0x147b) >> 0x13;
                          uVar82 = uVar76 * -100 + iVar61;
                          *(undefined2 *)((long)puVar87 + (4 - uVar75)) =
                               *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                          *(undefined2 *)((long)puVar87 + (6 - uVar75)) =
                               *(undefined2 *)(digit_table + uVar82 * 2);
                          uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar76] + 2;
                          if (uVar82 != 0) {
                            uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar82];
                          }
                          lVar99 = 8;
                        }
                        uVar94 = lVar99 - uVar94;
                      }
                      else {
                        uVar91 = (uint)(iVar61 * 0x147b) >> 0x13;
                        uVar76 = (uint)((uVar94 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar95 = uVar76 >> 8;
                        uVar82 = uVar95 * 0x147b >> 0x13;
                        uVar94 = (ulong)uVar82;
                        uVar76 = uVar82 * -100 + (uVar76 >> 8);
                        *(undefined2 *)((long)puVar87 + (4 - uVar75)) =
                             *(undefined2 *)(digit_table + (ulong)uVar91 * 2);
                        *(undefined2 *)((long)puVar87 + (6 - uVar75)) =
                             *(undefined2 *)(digit_table + (uVar91 * 0x7fffff9c + iVar61) * 2);
                        *(undefined2 *)((long)puVar87 + (8 - uVar75)) =
                             *(undefined2 *)(digit_table + uVar94 * 2);
                        *(undefined2 *)((long)puVar87 + (10 - uVar75)) =
                             *(undefined2 *)(digit_table + uVar76 * 2);
                        iVar69 = uVar95 * -10000 + iVar69;
                        if (iVar69 == 0) {
                          lVar99 = 0xc;
                        }
                        else {
                          uVar76 = (uint)(iVar69 * 0x147b) >> 0x13;
                          uVar94 = (ulong)uVar76;
                          uVar76 = uVar76 * -100 + iVar69;
                          *(undefined2 *)((long)puVar87 + (0xc - uVar75)) =
                               *(undefined2 *)(digit_table + uVar94 * 2);
                          *(undefined2 *)((long)puVar87 + (0xe - uVar75)) =
                               *(undefined2 *)(digit_table + uVar76 * 2);
                          lVar99 = 0x10;
                        }
                        uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar94] + 2;
                        if (uVar76 != 0) {
                          uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar76];
                        }
                        uVar94 = lVar99 - uVar94;
                      }
                      puVar74 = (uint *)((long)puVar87 + ((uVar94 & 0xffffffff) - uVar75));
                      *(undefined2 *)puVar70 = 0x2e30;
                      if ((int)uVar68 < 0) {
                        uVar76 = -uVar68;
                        if ((int)-uVar68 < 2) {
                          uVar76 = 1;
                        }
                        switchD_00570541::default
                                  ((undefined2 *)((long)puVar70 + 2),0x30,(ulong)uVar76);
                      }
                    }
                    else {
                      uVar75 = uVar94 / 100000000;
                      uVar76 = (uint)uVar75;
                      puVar87 = (undefined2 *)((long)puVar70 + (2 - (ulong)(uVar76 < 100000000)));
                      iVar90 = (int)((uVar75 & 0xffffffff) / 10000);
                      iVar61 = iVar90 * -10000 + uVar76;
                      uVar94 = uVar75 * 0xfa0a1f00 + uVar94;
                      iVar69 = (int)(((uVar75 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar95 = (uint)(iVar69 * 0x29) >> 0xc;
                      uVar91 = uVar95 * -100 + iVar69;
                      uVar82 = iVar69 * -100 + iVar90;
                      *puVar70 = 0x3030303030303030;
                      puVar70[1] = 0x3030303030303030;
                      puVar70[2] = 0x3030303030303030;
                      *(char *)((long)puVar70 + 1) = (char)uVar95 + '0';
                      uVar75 = (ulong)(uVar91 < 10 && uVar76 < 100000000);
                      *puVar87 = *(undefined2 *)(digit_table + uVar75 + uVar91 * 2);
                      *(undefined2 *)((long)puVar87 + (2 - uVar75)) =
                           *(undefined2 *)(digit_table + uVar82 * 2);
                      iVar69 = (int)uVar94;
                      if (iVar69 == 0) {
                        if (iVar61 == 0) {
                          uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar91];
                          if (uVar82 != 0) {
                            uVar94 = 0;
                          }
                          uVar94 = uVar94 + (byte)dec_trailing_zero_table[uVar82];
                          lVar78 = 4;
                        }
                        else {
                          uVar76 = (uint)(iVar61 * 0x147b) >> 0x13;
                          uVar82 = uVar76 * -100 + iVar61;
                          *(undefined2 *)((long)puVar87 + (4 - uVar75)) =
                               *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                          *(undefined2 *)((long)puVar87 + (6 - uVar75)) =
                               *(undefined2 *)(digit_table + uVar82 * 2);
                          uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar76] + 2;
                          if (uVar82 != 0) {
                            uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar82];
                          }
                          lVar78 = 8;
                        }
                        uVar94 = lVar78 - uVar94;
                      }
                      else {
                        uVar91 = (uint)(iVar61 * 0x147b) >> 0x13;
                        uVar76 = (uint)((uVar94 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar95 = uVar76 >> 8;
                        uVar82 = uVar95 * 0x147b >> 0x13;
                        uVar94 = (ulong)uVar82;
                        uVar76 = uVar82 * -100 + (uVar76 >> 8);
                        *(undefined2 *)((long)puVar87 + (4 - uVar75)) =
                             *(undefined2 *)(digit_table + (ulong)uVar91 * 2);
                        *(undefined2 *)((long)puVar87 + (6 - uVar75)) =
                             *(undefined2 *)(digit_table + (uVar91 * 0x7fffff9c + iVar61) * 2);
                        *(undefined2 *)((long)puVar87 + (8 - uVar75)) =
                             *(undefined2 *)(digit_table + uVar94 * 2);
                        *(undefined2 *)((long)puVar87 + (10 - uVar75)) =
                             *(undefined2 *)(digit_table + uVar76 * 2);
                        iVar69 = uVar95 * -10000 + iVar69;
                        if (iVar69 == 0) {
                          lVar78 = 0xc;
                        }
                        else {
                          uVar76 = (uint)(iVar69 * 0x147b) >> 0x13;
                          uVar94 = (ulong)uVar76;
                          uVar76 = uVar76 * -100 + iVar69;
                          *(undefined2 *)((long)puVar87 + (0xc - uVar75)) =
                               *(undefined2 *)(digit_table + uVar94 * 2);
                          *(undefined2 *)((long)puVar87 + (0xe - uVar75)) =
                               *(undefined2 *)(digit_table + uVar76 * 2);
                          lVar78 = 0x10;
                        }
                        uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar94] + 2;
                        if (uVar76 != 0) {
                          uVar94 = (ulong)(byte)dec_trailing_zero_table[uVar76];
                        }
                        uVar94 = lVar78 - uVar94;
                      }
                      puVar105 = (uint *)((long)puVar87 + ((uVar94 & 0xffffffff) - uVar75));
                      uVar94 = 1;
                      if (1 < (int)uVar68) {
                        uVar94 = (ulong)uVar68;
                      }
                      uVar75 = 0;
                      do {
                        *(byte *)((long)puVar74 + uVar75 + lVar99) =
                             *(byte *)((long)puVar74 + uVar75 + lVar99 + 1);
                        uVar75 = uVar75 + 1;
                      } while (uVar94 != uVar75);
                      puVar74 = (uint *)((undefined1 *)((ulong)uVar68 + (long)puVar70) + 2);
                      *(undefined1 *)((ulong)uVar68 + (long)puVar70) = 0x2e;
                      if (puVar74 < puVar105) {
                        puVar74 = puVar105;
                      }
                    }
                  }
                  else {
                    uVar75 = uVar94 / 100000000;
                    uVar68 = (uint)uVar75;
                    lVar99 = 2 - (ulong)(uVar68 < 100000000);
                    iVar83 = (int)((uVar75 & 0xffffffff) / 10000);
                    iVar81 = iVar83 * -10000 + uVar68;
                    uVar94 = uVar75 * 0xfa0a1f00 + uVar94;
                    iVar90 = (int)(((uVar75 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                    uVar91 = (uint)(iVar90 * 0x29) >> 0xc;
                    uVar82 = uVar91 * -100 + iVar90;
                    uVar76 = iVar90 * -100 + iVar83;
                    *(char *)((long)puVar70 + 1) = (char)uVar91 + '0';
                    uVar75 = (ulong)(uVar82 < 10 && uVar68 < 100000000);
                    *(undefined2 *)((long)puVar70 + lVar99) =
                         *(undefined2 *)(digit_table + uVar75 + uVar82 * 2);
                    lVar99 = lVar99 - uVar75;
                    *(undefined2 *)((long)puVar70 + lVar99 + 2) =
                         *(undefined2 *)(digit_table + uVar76 * 2);
                    iVar90 = (int)uVar94;
                    if (iVar90 == 0) {
                      if (iVar81 == 0) {
                        uVar68 = (uint)(byte)dec_trailing_zero_table[uVar82];
                        if (uVar76 != 0) {
                          uVar68 = 0;
                        }
                        uVar68 = uVar68 + (byte)dec_trailing_zero_table[uVar76];
                        iVar90 = 4;
                      }
                      else {
                        uVar68 = (uint)(iVar81 * 0x147b) >> 0x13;
                        uVar76 = uVar68 * -100 + iVar81;
                        *(undefined2 *)((long)puVar70 + lVar99 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                        *(undefined2 *)((long)puVar70 + lVar99 + 6) =
                             *(undefined2 *)(digit_table + uVar76 * 2);
                        uVar68 = (byte)dec_trailing_zero_table[uVar68] + 2;
                        if (uVar76 != 0) {
                          uVar68 = (uint)(byte)dec_trailing_zero_table[uVar76];
                        }
                        iVar90 = 8;
                      }
                      uVar68 = iVar90 - uVar68;
                    }
                    else {
                      uVar91 = (uint)(iVar81 * 0x147b) >> 0x13;
                      uVar68 = (uint)((uVar94 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar95 = uVar68 >> 8;
                      uVar82 = uVar95 * 0x147b >> 0x13;
                      uVar76 = uVar82 * -100 + (uVar68 >> 8);
                      *(undefined2 *)((long)puVar70 + lVar99 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar91 * 2);
                      *(undefined2 *)((long)puVar70 + lVar99 + 6) =
                           *(undefined2 *)(digit_table + (uVar91 * 0x7fffff9c + iVar81) * 2);
                      *(undefined2 *)((long)puVar70 + lVar99 + 8) =
                           *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                      *(undefined2 *)((long)puVar70 + lVar99 + 10) =
                           *(undefined2 *)(digit_table + uVar76 * 2);
                      iVar90 = uVar95 * -10000 + iVar90;
                      if (iVar90 == 0) {
                        uVar68 = (byte)dec_trailing_zero_table[uVar82] + 2;
                        if (uVar76 != 0) {
                          uVar68 = (uint)(byte)dec_trailing_zero_table[uVar76];
                        }
                        iVar90 = 0xc;
                      }
                      else {
                        uVar68 = (uint)(iVar90 * 0x147b) >> 0x13;
                        uVar76 = uVar68 * -100 + iVar90;
                        *(undefined2 *)((long)puVar70 + lVar99 + 0xc) =
                             *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                        *(undefined2 *)((long)puVar70 + lVar99 + 0xe) =
                             *(undefined2 *)(digit_table + uVar76 * 2);
                        uVar68 = (byte)dec_trailing_zero_table[uVar68] + 2;
                        if (uVar76 != 0) {
                          uVar68 = (uint)(byte)dec_trailing_zero_table[uVar76];
                        }
                        iVar90 = 0x10;
                      }
                      uVar68 = iVar90 - uVar68;
                    }
                    puVar87 = (undefined2 *)
                              ((long)puVar70 +
                              (((ulong)uVar68 + lVar99) - (ulong)((ulong)uVar68 + lVar99 == 2)));
                    uVar76 = (iVar61 + iVar69) - 1;
                    *(undefined1 *)puVar70 = *(undefined1 *)((long)puVar70 + 1);
                    *(undefined1 *)((long)puVar70 + 1) = 0x2e;
                    *puVar87 = 0x2d65;
                    uVar82 = uVar76 >> 0x1f;
                    pcVar60 = (char *)((long)puVar87 + (ulong)uVar82 + 1);
                    uVar68 = -uVar76;
                    if (0 < (int)uVar76) {
                      uVar68 = uVar76;
                    }
                    if (uVar68 < 100) {
                      *(undefined2 *)pcVar60 =
                           *(undefined2 *)(digit_table + (ulong)(uVar68 < 10) + (ulong)uVar68 * 2);
                      puVar74 = (uint *)(pcVar60 + (2 - (ulong)(uVar68 < 10)));
                    }
                    else {
                      *pcVar60 = (char)(uVar68 * 0x290 >> 0x10) + '0';
                      *(undefined2 *)((long)puVar87 + (ulong)uVar82 + 2) =
                           *(undefined2 *)
                            (digit_table + ((uVar68 * 0x290 >> 0x10) * 0x7fffff9c + uVar68) * 2);
                      puVar74 = (uint *)((long)puVar87 + (ulong)uVar82 + 4);
                    }
                  }
                }
              }
            }
LAB_0126cb3c:
            if (puVar74 != (uint *)0x0) {
              *(byte *)puVar74 = 0x2c;
              puVar74 = (uint *)((long)puVar74 + 1);
              goto LAB_0126cb85;
            }
            goto LAB_0126d5c2;
          }
          if (((uint)uVar94 & 7) == 5) {
            uVar75 = uVar94 >> 8;
            puVar105 = (uint *)(pyVar84->uni).str;
            uVar64 = sVar107;
            puVar103 = puVar86;
            if (puVar86 <= (uint *)((long)puVar74 + uVar75 * 6 + 0x10)) {
              uVar64 = uVar75 * 6 + 0x10;
              uVar104 = sVar107 >> 1;
              if (sVar107 >> 1 <= uVar64) {
                uVar104 = uVar64;
              }
              uVar64 = (uVar104 + 0xf & 0xfffffffffffffff0) + sVar107;
              pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,uVar64);
              if (pbVar79 == (byte *)0x0) goto LAB_0126d569;
              puVar103 = (uint *)(pbVar79 + (uVar64 - ((long)local_90 - (long)puVar86)));
              memmove(puVar103,pbVar79 + ((long)puVar86 - (long)local_f8),
                      (long)local_90 - (long)puVar86);
              puVar74 = (uint *)(pbVar79 + ((long)puVar74 - (long)local_f8));
              local_90 = (uint *)(pbVar79 + uVar64);
              local_f8 = pbVar79;
            }
            if ((puVar102 != enc_table_cpy) || ((pyVar84->tag & 0x18) == 0)) {
              puVar86 = (uint *)(uVar75 + (long)puVar105);
              *(byte *)puVar74 = 0x22;
LAB_0126b592:
              lVar99 = (long)puVar86 - (long)puVar105;
              if (0xf < lVar99) {
                lVar78 = 0;
                do {
                  puVar59 = (uint *)((long)puVar74 + lVar78 + 1);
                  puVar106 = (uint *)((long)puVar105 + lVar78);
                  if (puVar102[*(byte *)((long)puVar105 + lVar78)] != '\0') goto LAB_0126b927;
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 1)] != '\0') {
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 1);
                    puVar106 = (uint *)((long)puVar105 + lVar78);
                    goto LAB_0126b755;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 2)] != '\0') {
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 1);
                    puVar106 = (uint *)((long)puVar105 + lVar78);
                    goto LAB_0126b771;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 3)] != '\0') {
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 1);
                    puVar106 = (uint *)((long)puVar105 + lVar78);
                    goto LAB_0126b791;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 4)] != '\0') {
                    puVar106 = (uint *)((byte *)((long)puVar105 + lVar78) + 4);
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 5);
                    *(undefined4 *)((long)puVar74 + lVar78 + 1) =
                         *(undefined4 *)((long)puVar105 + lVar78);
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 5)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 5);
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 6);
                    *(byte *)((long)puVar59 + -1) = pbVar79[4];
                    *(undefined4 *)((long)puVar59 + -5) = *(undefined4 *)pbVar79;
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 6)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 6);
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 7);
                    *(ushort *)((long)puVar59 + -2) = *(ushort *)(pbVar79 + 4);
                    *(undefined4 *)((long)puVar59 + -6) = *(undefined4 *)pbVar79;
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 7)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 7);
                    uVar3 = *(undefined4 *)pbVar79;
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 8);
                    *(undefined4 *)((long)puVar74 + lVar78 + 4) = *(undefined4 *)(pbVar79 + 3);
                    *(undefined4 *)((long)puVar74 + lVar78 + 1) = uVar3;
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 8)] != '\0') {
                    puVar106 = (uint *)((byte *)((long)puVar105 + lVar78) + 8);
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 9);
                    *(undefined8 *)((long)puVar74 + lVar78 + 1) =
                         *(undefined8 *)((long)puVar105 + lVar78);
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 9)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 9);
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 10);
                    *(byte *)((long)puVar59 + -1) = pbVar79[8];
                    *(undefined8 *)((long)puVar59 + -9) = *(undefined8 *)pbVar79;
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 10)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 10);
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 0xb);
                    *(ushort *)((long)puVar59 + -2) = *(ushort *)(pbVar79 + 8);
                    *(undefined8 *)((long)puVar59 + -10) = *(undefined8 *)pbVar79;
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 0xb)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 0xb);
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 0xc);
                    puVar59[-1] = *(uint *)(pbVar79 + 7);
                    *(undefined8 *)((long)puVar59 + -0xb) = *(undefined8 *)pbVar79;
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 0xc)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 0xc);
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 0xd);
                    puVar59[-1] = *(uint *)(pbVar79 + 8);
                    *(undefined8 *)(puVar59 + -3) = *(undefined8 *)pbVar79;
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 0xd)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 0xd);
                    uVar71 = *(undefined8 *)pbVar79;
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 0xe);
                    *(undefined8 *)((long)puVar74 + lVar78 + 6) = *(undefined8 *)(pbVar79 + 5);
                    *(undefined8 *)((long)puVar74 + lVar78 + 1) = uVar71;
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 0xe)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 0xe);
                    uVar71 = *(undefined8 *)pbVar79;
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 0xf);
                    *(undefined8 *)((long)puVar74 + lVar78 + 7) = *(undefined8 *)(pbVar79 + 6);
                    *(undefined8 *)((long)puVar74 + lVar78 + 1) = uVar71;
                    goto LAB_0126b927;
                  }
                  if (puVar102[*(byte *)((long)puVar105 + lVar78 + 0xf)] != '\0') {
                    pbVar79 = (byte *)((long)puVar105 + lVar78);
                    puVar106 = (uint *)(pbVar79 + 0xf);
                    uVar71 = *(undefined8 *)pbVar79;
                    puVar59 = (uint *)((long)puVar74 + lVar78 + 0x10);
                    *(undefined8 *)((long)puVar74 + lVar78 + 8) = *(undefined8 *)(pbVar79 + 7);
                    *(undefined8 *)((long)puVar74 + lVar78 + 1) = uVar71;
                    goto LAB_0126b927;
                  }
                  uVar71 = *(undefined8 *)(puVar106 + 2);
                  *(undefined8 *)puVar59 = *(undefined8 *)puVar106;
                  *(undefined8 *)((long)puVar74 + lVar78 + 9) = uVar71;
                  lVar78 = lVar78 + 0x10;
                  lVar99 = lVar99 + -0x10;
                } while (0xf < lVar99);
                puVar74 = (uint *)((long)puVar74 + lVar78);
                puVar105 = (uint *)((long)puVar105 + lVar78);
              }
              puVar59 = (uint *)((long)puVar74 + 1);
              puVar106 = puVar105;
              for (lVar99 = (long)puVar86 - (long)puVar105; 3 < lVar99; lVar99 = lVar99 + -4) {
                if (puVar102[(byte)*puVar106] != '\0') goto LAB_0126b927;
                if (puVar102[*(byte *)((long)puVar106 + 1)] != '\0') goto LAB_0126b755;
                if (puVar102[*(byte *)((long)puVar106 + 2)] != '\0') goto LAB_0126b771;
                if (puVar102[*(byte *)((long)puVar106 + 3)] != '\0') goto LAB_0126b791;
                *puVar59 = *puVar106;
                puVar59 = puVar59 + 1;
                puVar106 = puVar106 + 1;
              }
              while( true ) {
                if (puVar86 <= puVar106) goto switchD_0126b94e_default;
                uVar68 = *puVar106;
                if (puVar102[(byte)uVar68] != '\0') break;
                puVar106 = (uint *)((long)puVar106 + 1);
                *(byte *)puVar59 = (byte)uVar68;
                puVar59 = (uint *)((long)puVar59 + 1);
              }
              goto LAB_0126b927;
            }
            *(byte *)puVar74 = 0x22;
            puVar74 = (uint *)((long)puVar74 + 1);
            if (0xfff < uVar94) {
              do {
                uVar71 = *(undefined8 *)(puVar105 + 2);
                *(undefined8 *)puVar74 = *(undefined8 *)puVar105;
                *(undefined8 *)(puVar74 + 2) = uVar71;
                puVar74 = puVar74 + 4;
                puVar105 = puVar105 + 4;
                uVar75 = uVar75 - 0x10;
              } while (0xf < uVar75);
            }
            for (; 3 < uVar75; uVar75 = uVar75 - 4) {
              *puVar74 = *puVar105;
              puVar74 = puVar74 + 1;
              puVar105 = puVar105 + 1;
            }
            if (uVar75 != 0) {
              uVar94 = 0;
              do {
                *(byte *)((long)puVar74 + uVar94) = *(byte *)((long)puVar105 + uVar94);
                uVar94 = uVar94 + 1;
              } while (uVar75 != uVar94);
              puVar74 = (uint *)((long)puVar74 + uVar94);
            }
            *(byte *)puVar74 = 0x22;
            pbVar79 = (byte *)((long)puVar74 + 1);
            goto LAB_0126cb68;
          }
          if ((~(byte)uVar94 & 6) == 0) {
            if (puVar86 <= puVar74 + 4) {
              uVar75 = sVar107 >> 1;
              if (uVar75 < 0x11) {
                uVar75 = 0x10;
              }
              sVar63 = (uVar75 + 0xf & 0xfffffffffffffff0) + sVar107;
              pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,sVar63);
              if (pbVar79 == (byte *)0x0) goto LAB_0126d569;
              sVar72 = (long)local_90 - (long)puVar86;
              memmove(pbVar79 + (sVar63 - sVar72),pbVar79 + ((long)puVar86 - (long)local_f8),sVar72)
              ;
              puVar74 = (uint *)(pbVar79 + ((long)puVar74 - (long)local_f8));
              local_90 = (uint *)(pbVar79 + sVar63);
              puVar86 = (uint *)(pbVar79 + (sVar63 - sVar72));
              sVar107 = sVar63;
              local_f8 = pbVar79;
            }
            if (0xff < uVar94) {
              bVar109 = bVar101 == 7;
              local_e0 = (ulong)bVar109;
              lVar99 = (uVar94 >> 8) << bVar109;
              puVar105 = puVar86 + -4;
              puVar103 = (uint *)((long)puVar74 + 1);
              *(ulong *)(puVar86 + -4) = uVar77 + lVar92 * 2;
              *(yyjson_mut_val **)(puVar86 + -2) = val;
              *(byte *)puVar74 = bVar109 << 5 | 0x5b;
              local_80 = (yyjson_mut_val *)(pyVar84->uni).u64;
              val = pyVar84;
              lVar92 = lVar99;
              if (bVar101 == 7) {
                local_80 = local_80->next;
              }
              goto LAB_0126b134;
            }
            bVar101 = (bVar101 == 7) * ' ';
            *(byte *)puVar74 = bVar101 + 0x5b;
            *(byte *)((long)puVar74 + 1) = bVar101 | 0x5d;
            *(byte *)((long)puVar74 + 2) = 0x2c;
            puVar74 = (uint *)((long)puVar74 + 3);
          }
          else {
            if (bVar101 == 1) {
              uVar94 = uVar94 >> 8;
              pvVar8 = (pyVar84->uni).ptr;
              if (puVar86 <= (uint *)((long)puVar74 + uVar94 + 2)) {
                uVar75 = sVar107 >> 1;
                if (sVar107 >> 1 <= uVar94 + 2) {
                  uVar75 = uVar94 + 2;
                }
                sVar63 = (uVar75 + 0xf & 0xfffffffffffffff0) + sVar107;
                pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,sVar63);
                if (pbVar79 == (byte *)0x0) goto LAB_0126d569;
                sVar72 = (long)local_90 - (long)puVar86;
                memmove(pbVar79 + (sVar63 - sVar72),pbVar79 + ((long)puVar86 - (long)local_f8),
                        sVar72);
                puVar74 = (uint *)(pbVar79 + ((long)puVar74 - (long)local_f8));
                local_90 = (uint *)(pbVar79 + sVar63);
                puVar86 = (uint *)(pbVar79 + (sVar63 - sVar72));
                sVar107 = sVar63;
                local_f8 = pbVar79;
              }
              switchD_00b1522a::default(puVar74,pvVar8,uVar94);
              pbVar79 = (byte *)((long)puVar74 + uVar94);
              puVar74 = (uint *)(pbVar79 + 1);
              *pbVar79 = 0x2c;
              goto LAB_0126cb85;
            }
            if (bVar101 == 2) {
              uVar94 = sVar107;
              puVar105 = puVar86;
              if (puVar86 <= puVar74 + 4) {
                uVar94 = sVar107 >> 1;
                if (uVar94 < 0x11) {
                  uVar94 = 0x10;
                }
                uVar94 = (uVar94 + 0xf & 0xfffffffffffffff0) + sVar107;
                pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,uVar94);
                if (pbVar79 == (byte *)0x0) goto LAB_0126d569;
                puVar105 = (uint *)(pbVar79 + (uVar94 - ((long)local_90 - (long)puVar86)));
                memmove(puVar105,pbVar79 + ((long)puVar86 - (long)local_f8),
                        (long)local_90 - (long)puVar86);
                puVar74 = (uint *)(pbVar79 + ((long)puVar74 - (long)local_f8));
                local_90 = (uint *)(pbVar79 + uVar94);
                local_f8 = pbVar79;
              }
              puVar74[0] = 0x6c6c756e;
              puVar74[1] = 0xa2c;
              puVar74 = (uint *)((long)puVar74 + 5);
              sVar107 = uVar94;
              puVar86 = puVar105;
            }
            else {
              if (bVar101 != 3) goto LAB_0126d4be;
              uVar94 = sVar107;
              puVar105 = puVar86;
              if (puVar86 <= puVar74 + 4) {
                uVar94 = sVar107 >> 1;
                if (uVar94 < 0x11) {
                  uVar94 = 0x10;
                }
                uVar94 = (uVar94 + 0xf & 0xfffffffffffffff0) + sVar107;
                pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,uVar94);
                if (pbVar79 == (byte *)0x0) goto LAB_0126d569;
                puVar105 = (uint *)(pbVar79 + (uVar94 - ((long)local_90 - (long)puVar86)));
                memmove(puVar105,pbVar79 + ((long)puVar86 - (long)local_f8),
                        (long)local_90 - (long)puVar86);
                puVar74 = (uint *)(pbVar79 + ((long)puVar74 - (long)local_f8));
                local_90 = (uint *)(pbVar79 + uVar94);
                local_f8 = pbVar79;
              }
              bVar109 = (pyVar84->tag & 0x18) != 0;
              uVar71 = 0xa2c65736c6166;
              if (bVar109) {
                uVar71 = 0xa2c65757274;
              }
              *(undefined8 *)puVar74 = uVar71;
              puVar74 = (uint *)((long)puVar74 + (6 - (ulong)bVar109));
              sVar107 = uVar94;
              puVar86 = puVar105;
            }
          }
          goto LAB_0126cb85;
        }
        local_f8 = (byte *)0x0;
LAB_0126d569:
        if (dat_len != (usize *)0x0) {
          *dat_len = 0;
        }
        pyVar65 = &local_48;
        if (err != (yyjson_write_err *)0x0) {
          pyVar65 = err;
        }
        pyVar66->code = 2;
        pyVar65->msg = "memory allocation failed";
      }
      else {
        puVar102 = enc_table_cpy;
        if ((flg & 2) == 0) {
          puVar98 = enc_table_cpy_slash;
        }
        else {
          puVar102 = enc_table_esc;
          puVar98 = enc_table_esc_slash;
        }
        if ((flg & 4) == 0) {
          puVar98 = puVar102;
        }
        uVar77 = estimated_val_num * 0x20 + 0x40;
        local_f8 = (byte *)(*p_Var4)(pvVar6,uVar77);
        if (local_f8 != (byte *)0x0) {
          uVar68 = (uint)val->tag & 7;
          bVar109 = uVar68 == 7;
          local_90 = (uint *)(ulong)bVar109;
          lVar92 = (val->tag >> 8) << bVar109;
          *local_f8 = bVar109 << 5 | 0x5b;
          local_f8[1] = 10;
          uVar58 = (val->uni).u64;
          if (uVar68 == 7) {
            uVar58 = *(uint64_t *)(uVar58 + 0x10);
          }
          lVar99 = (ulong)((flg & 0x40) == 0) * 2 + 2;
          puVar88 = (ulong *)(local_f8 + (estimated_val_num * 8 + 0x10) * 4);
          puVar105 = (uint *)(local_f8 + 2);
          pyVar84 = *(yyjson_mut_val **)(uVar58 + 0x10);
          lVar78 = 1;
          local_88 = puVar88;
          local_80 = val;
LAB_012688f2:
          do {
            uVar64 = (ulong)local_90 & 0xff;
            uVar94 = lVar78 * 4 + 0x20;
            uVar75 = lVar78 * 4 + 0x10;
            pyVar85 = pyVar84;
            sVar107 = uVar77;
            puVar89 = puVar88;
LAB_0126891e:
            uVar104 = pyVar85->tag;
            bVar101 = (byte)uVar104 & 7;
            uVar68 = (uint)lVar92;
            local_c0 = (uint)uVar64;
            sVar63 = sVar107;
            puVar88 = puVar89;
            if (bVar101 == 4) {
              uVar77 = uVar94;
              if ((uVar68 & local_c0) != 0) {
                uVar77 = 0x20;
              }
              if (puVar89 <= (ulong *)((long)puVar105 + uVar77)) {
                uVar104 = sVar107 >> 1;
                if (sVar107 >> 1 <= uVar77) {
                  uVar104 = uVar77;
                }
                sVar63 = (uVar104 + 0xf & 0xfffffffffffffff0) + sVar107;
                pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,sVar63);
                if (pbVar79 == (byte *)0x0) goto LAB_0126d51f;
                puVar88 = (ulong *)(pbVar79 + (sVar63 - ((long)local_88 - (long)puVar89)));
                memmove(puVar88,pbVar79 + ((long)puVar89 - (long)local_f8),
                        (long)local_88 - (long)puVar89);
                puVar105 = (uint *)(pbVar79 + ((long)puVar105 - (long)local_f8));
                local_88 = (ulong *)(pbVar79 + sVar63);
                local_f8 = pbVar79;
              }
              lVar62 = lVar78;
              puVar103 = puVar105;
              if (lVar78 != 0 && (uVar68 & local_c0) == 0) {
                do {
                  puVar105 = (uint *)((long)puVar103 + lVar99);
                  *puVar103 = 0x20202020;
                  lVar62 = lVar62 + -1;
                  puVar103 = puVar105;
                } while (lVar62 != 0);
              }
              uVar77 = (pyVar85->uni).u64;
              uVar68 = (uint)(uVar77 >> 0x20);
              if ((pyVar85->tag & 0x10) == 0) {
                uVar68 = uVar68 >> 0x1f & (uint)(pyVar85->tag >> 3);
                *(byte *)puVar105 = 0x2d;
                uVar104 = -uVar77;
                if (uVar68 == 0) {
                  uVar104 = uVar77;
                }
                pbVar79 = (byte *)((ulong)uVar68 + (long)puVar105);
                if (uVar104 < 100000000) {
                  if (uVar104 < 100) {
                    *(undefined2 *)pbVar79 =
                         *(undefined2 *)(digit_table + (ulong)(uVar104 < 10) + uVar104 * 2);
                    puVar105 = (uint *)(pbVar79 + (2 - (ulong)(uVar104 < 10)));
                  }
                  else {
                    iVar69 = (int)uVar104;
                    if (uVar104 < 10000) {
                      uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                      uVar77 = (ulong)(uVar104 < 1000);
                      *(undefined2 *)pbVar79 =
                           *(undefined2 *)(digit_table + uVar77 + (ulong)uVar68 * 2);
                      *(undefined2 *)(pbVar79 + (2 - uVar77)) =
                           *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                      puVar105 = (uint *)(pbVar79 + (4 - uVar77));
                    }
                    else if (uVar104 < 1000000) {
                      iVar69 = (int)(uVar104 * 0x68db9 >> 0x20) * -10000 + iVar69;
                      uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                      uVar77 = (ulong)(uVar104 < 100000);
                      *(undefined2 *)pbVar79 =
                           *(undefined2 *)(digit_table + uVar77 + (uVar104 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar79 + (2 - uVar77)) =
                           *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                      *(undefined2 *)(pbVar79 + (4 - uVar77)) =
                           *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                      puVar105 = (uint *)(pbVar79 + (6 - uVar77));
                    }
                    else {
                      uVar68 = (uint)(uVar104 * 0x68db8bb >> 0x20);
                      uVar76 = uVar68 >> 8;
                      iVar69 = uVar76 * -10000 + iVar69;
                      uVar76 = uVar76 * 0x147b >> 0x13;
                      uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                      uVar77 = (ulong)(uVar104 < 10000000);
                      *(undefined2 *)pbVar79 =
                           *(undefined2 *)(digit_table + uVar77 + (ulong)uVar76 * 2);
                      *(undefined2 *)(pbVar79 + (2 - uVar77)) =
                           *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                      *(undefined2 *)(pbVar79 + (4 - uVar77)) =
                           *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                      *(undefined2 *)(pbVar79 + (6 - uVar77)) =
                           *(undefined2 *)(digit_table + (uVar82 * -100 + iVar69) * 2);
                      puVar105 = (uint *)(pbVar79 + (8 - uVar77));
                    }
                  }
                }
                else {
                  uVar77 = uVar104 / 100000000;
                  uVar73 = uVar77 * 0xfa0a1f00 + uVar104;
                  iVar69 = (int)uVar77;
                  if (uVar104 < 10000000000000000) {
                    if (uVar104 < 10000000000) {
                      *(undefined2 *)pbVar79 =
                           *(undefined2 *)(digit_table + (ulong)(uVar104 < 1000000000) + uVar77 * 2)
                      ;
                      pbVar79 = pbVar79 + (2 - (ulong)(uVar104 < 1000000000));
                    }
                    else if (uVar104 < 1000000000000) {
                      uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                      uVar77 = (ulong)(uVar104 < 100000000000);
                      *(undefined2 *)pbVar79 =
                           *(undefined2 *)(digit_table + uVar77 + (ulong)uVar68 * 2);
                      *(undefined2 *)(pbVar79 + (2 - uVar77)) =
                           *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                      pbVar79 = pbVar79 + (4 - uVar77);
                    }
                    else if (uVar104 < 100000000000000) {
                      iVar69 = (int)(uVar77 * 0x68db9 >> 0x20) * -10000 + iVar69;
                      uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                      uVar104 = (ulong)(uVar104 < 10000000000000);
                      *(undefined2 *)pbVar79 =
                           *(undefined2 *)(digit_table + uVar104 + (uVar77 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar79 + (2 - uVar104)) =
                           *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                      *(undefined2 *)(pbVar79 + (4 - uVar104)) =
                           *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                      pbVar79 = pbVar79 + (6 - uVar104);
                    }
                    else {
                      uVar68 = (uint)(uVar77 * 0x68db8bb >> 0x20);
                      uVar76 = uVar68 >> 8;
                      iVar69 = uVar76 * -10000 + iVar69;
                      uVar76 = uVar76 * 0x147b >> 0x13;
                      uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                      uVar77 = (ulong)(uVar104 < 1000000000000000);
                      *(undefined2 *)pbVar79 =
                           *(undefined2 *)(digit_table + uVar77 + (ulong)uVar76 * 2);
                      *(undefined2 *)(pbVar79 + (2 - uVar77)) =
                           *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                      *(undefined2 *)(pbVar79 + (4 - uVar77)) =
                           *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                      *(undefined2 *)(pbVar79 + (6 - uVar77)) =
                           *(undefined2 *)(digit_table + (uVar82 * -100 + iVar69) * 2);
                      pbVar79 = pbVar79 + (8 - uVar77);
                    }
                    uVar68 = (uint)((uVar73 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar76 = uVar68 >> 8;
                    iVar69 = uVar76 * -10000 + (int)uVar73;
                    uVar76 = uVar76 * 0x147b >> 0x13;
                    uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                    *(undefined2 *)(pbVar79 + 2) =
                         *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                    *(undefined2 *)(pbVar79 + 4) = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                    *(undefined2 *)(pbVar79 + 6) =
                         *(undefined2 *)(digit_table + (uVar82 * 0x7fffff9c + iVar69) * 2);
                    puVar105 = (uint *)(pbVar79 + 8);
                  }
                  else {
                    uVar77 = uVar104 / 1000000000000;
                    iVar61 = (int)uVar77;
                    if (uVar104 < 1000000000000000000) {
                      iVar90 = (int)(uVar77 * 0x68db9 >> 0x20) * -10000 + iVar61;
                      uVar68 = (uint)(iVar90 * 0x147b) >> 0x13;
                      uVar104 = (ulong)(uVar104 < 100000000000000000);
                      *(undefined2 *)pbVar79 =
                           *(undefined2 *)(digit_table + uVar104 + (uVar77 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar79 + (2 - uVar104)) =
                           *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                      *(undefined2 *)(pbVar79 + (4 - uVar104)) =
                           *(undefined2 *)(digit_table + (uVar68 * -100 + iVar90) * 2);
                      lVar62 = 6 - uVar104;
                    }
                    else {
                      uVar68 = (uint)(uVar77 / 10000);
                      iVar90 = uVar68 * -10000 + iVar61;
                      uVar68 = uVar68 / 100;
                      uVar76 = (uint)(iVar90 * 0x147b) >> 0x13;
                      uVar104 = (ulong)(uVar104 < 10000000000000000000);
                      *(undefined2 *)pbVar79 =
                           *(undefined2 *)(digit_table + uVar104 + (ulong)uVar68 * 2);
                      *(undefined2 *)(pbVar79 + (2 - uVar104)) =
                           *(undefined2 *)
                            (digit_table + (uVar68 * -100 + (int)(uVar77 / 10000)) * 2);
                      *(undefined2 *)(pbVar79 + (4 - uVar104)) =
                           *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                      *(undefined2 *)(pbVar79 + (6 - uVar104)) =
                           *(undefined2 *)(digit_table + (uVar76 * -100 + iVar90) * 2);
                      lVar62 = 8 - uVar104;
                    }
                    pbVar79 = pbVar79 + lVar62;
                    iVar69 = iVar69 + iVar61 * -10000;
                    uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                    *(undefined2 *)(pbVar79 + 2) =
                         *(undefined2 *)(digit_table + (uVar68 * 0x7fffff9c + iVar69) * 2);
                    uVar68 = (uint)((uVar73 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar76 = uVar68 >> 8;
                    iVar69 = uVar76 * -10000 + (int)uVar73;
                    uVar76 = uVar76 * 0x147b >> 0x13;
                    uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                    *(undefined2 *)(pbVar79 + 4) = *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                    *(undefined2 *)(pbVar79 + 6) =
                         *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                    *(undefined2 *)(pbVar79 + 8) = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                    *(undefined2 *)(pbVar79 + 10) =
                         *(undefined2 *)(digit_table + (uVar82 * 0x7fffff9c + iVar69) * 2);
                    puVar105 = (uint *)(pbVar79 + 0xc);
                  }
                }
              }
              else {
                uVar104 = uVar77 & 0xfffffffffffff;
                uVar68 = uVar68 >> 0x14 & 0x7ff;
                if (uVar68 == 0x7ff) {
                  if ((flg & 0x10) == 0) {
                    if ((flg & 8) == 0) {
                      puVar105 = (uint *)0x0;
                    }
                    else if (uVar104 == 0) {
                      *(byte *)puVar105 = 0x2d;
                      puVar70 = (undefined8 *)((long)puVar105 - ((long)uVar77 >> 0x3f));
                      puVar105 = (uint *)(puVar70 + 1);
                      *puVar70 = 0x7974696e69666e49;
                    }
                    else {
                      *puVar105 = 0x4e614e;
                      puVar105 = (uint *)((long)puVar105 + 3);
                    }
                  }
                  else {
                    *puVar105 = 0x6c6c756e;
                    puVar105 = puVar105 + 1;
                  }
                }
                else {
                  *(byte *)puVar105 = 0x2d;
                  lVar62 = -((long)uVar77 >> 0x3f);
                  puVar70 = (undefined8 *)((long)puVar105 + lVar62);
                  if ((uVar77 & 0x7fffffffffffffff) == 0) {
                    *(undefined4 *)puVar70 = 0x302e30;
                    puVar105 = (uint *)((long)puVar70 + 3);
                  }
                  else if (uVar68 == 0) {
                    yyjson_mut_write_opts_impl();
                    puVar105 = local_70;
                  }
                  else {
                    uVar73 = uVar104 + 0x10000000000000;
                    if (uVar68 - 0x3ff < 0x35) {
                      lVar57 = 0;
                      if (uVar73 != 0) {
                        for (; (uVar73 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                        }
                      }
                      if (0x433 - uVar68 <= (uint)lVar57) {
                        uVar73 = uVar73 >> ((byte)(0x433 - uVar68) & 0x3f);
                        if (uVar73 < 100000000) {
                          if (uVar73 < 100) {
                            *(undefined2 *)puVar70 =
                                 *(undefined2 *)(digit_table + (ulong)(uVar73 < 10) + uVar73 * 2);
                            puVar87 = (undefined2 *)((long)puVar70 + (2 - (ulong)(uVar73 < 10)));
                          }
                          else {
                            iVar69 = (int)uVar73;
                            if (uVar73 < 10000) {
                              uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                              uVar77 = (ulong)(uVar73 < 1000);
                              *(undefined2 *)puVar70 =
                                   *(undefined2 *)(digit_table + uVar77 + (ulong)uVar68 * 2);
                              *(undefined2 *)((long)puVar70 + (2 - uVar77)) =
                                   *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                              puVar87 = (undefined2 *)((long)puVar70 + (4 - uVar77));
                            }
                            else if (uVar73 < 1000000) {
                              iVar69 = (int)(uVar73 * 0x68db9 >> 0x20) * -10000 + iVar69;
                              uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                              uVar77 = (ulong)(uVar73 < 100000);
                              *(undefined2 *)puVar70 =
                                   *(undefined2 *)
                                    (digit_table + uVar77 + (uVar73 * 0x68db9 >> 0x20) * 2);
                              *(undefined2 *)((long)puVar70 + (2 - uVar77)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                              *(undefined2 *)((long)puVar70 + (4 - uVar77)) =
                                   *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                              puVar87 = (undefined2 *)((long)puVar70 + (6 - uVar77));
                            }
                            else {
                              uVar68 = (uint)(uVar73 * 0x68db8bb >> 0x20);
                              uVar76 = uVar68 >> 8;
                              iVar69 = uVar76 * -10000 + iVar69;
                              uVar82 = uVar76 * 0x147b >> 0x13;
                              uVar76 = (uint)(iVar69 * 0x147b) >> 0x13;
                              uVar77 = (ulong)(uVar73 < 10000000);
                              *(undefined2 *)puVar70 =
                                   *(undefined2 *)(digit_table + uVar77 + (ulong)uVar82 * 2);
                              *(undefined2 *)((long)puVar70 + (2 - uVar77)) =
                                   *(undefined2 *)
                                    (digit_table + (uVar82 * -100 + (uVar68 >> 8)) * 2);
                              *(undefined2 *)((long)puVar70 + (4 - uVar77)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                              *(undefined2 *)((long)puVar70 + (6 - uVar77)) =
                                   *(undefined2 *)(digit_table + (uVar76 * -100 + iVar69) * 2);
                              puVar87 = (undefined2 *)((long)puVar70 + (8 - uVar77));
                            }
                          }
                        }
                        else {
                          auVar15._8_8_ = 0;
                          auVar15._0_8_ = uVar73;
                          uVar77 = SUB168(auVar15 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                          if (uVar73 < 10000000000) {
                            *(undefined2 *)puVar70 =
                                 *(undefined2 *)
                                  (digit_table + (ulong)(uVar73 < 1000000000) + uVar77 * 2);
                            puVar87 = (undefined2 *)
                                      ((long)puVar70 + (2 - (ulong)(uVar73 < 1000000000)));
                          }
                          else {
                            iVar69 = (int)uVar77;
                            if (uVar73 < 1000000000000) {
                              uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                              uVar104 = (ulong)(uVar73 < 100000000000);
                              *(undefined2 *)puVar70 =
                                   *(undefined2 *)(digit_table + uVar104 + (ulong)uVar68 * 2);
                              *(undefined2 *)((long)puVar70 + (2 - uVar104)) =
                                   *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                              puVar87 = (undefined2 *)((long)puVar70 + (4 - uVar104));
                            }
                            else if (uVar73 < 100000000000000) {
                              iVar69 = (int)(uVar77 * 0x68db9 >> 0x20) * -10000 + iVar69;
                              uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                              uVar104 = (ulong)(uVar73 < 10000000000000);
                              *(undefined2 *)puVar70 =
                                   *(undefined2 *)
                                    (digit_table + uVar104 + (uVar77 * 0x68db9 >> 0x20) * 2);
                              *(undefined2 *)((long)puVar70 + (2 - uVar104)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                              *(undefined2 *)((long)puVar70 + (4 - uVar104)) =
                                   *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                              puVar87 = (undefined2 *)((long)puVar70 + (6 - uVar104));
                            }
                            else {
                              uVar68 = (uint)(uVar77 * 0x68db8bb >> 0x20);
                              uVar76 = uVar68 >> 8;
                              iVar69 = uVar76 * -10000 + iVar69;
                              uVar76 = uVar76 * 0x147b >> 0x13;
                              uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                              uVar104 = (ulong)(uVar73 < 1000000000000000);
                              *(undefined2 *)puVar70 =
                                   *(undefined2 *)(digit_table + uVar104 + (ulong)uVar76 * 2);
                              *(undefined2 *)((long)puVar70 + (2 - uVar104)) =
                                   *(undefined2 *)
                                    (digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                              *(undefined2 *)((long)puVar70 + (4 - uVar104)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                              *(undefined2 *)((long)puVar70 + (6 - uVar104)) =
                                   *(undefined2 *)(digit_table + (uVar82 * -100 + iVar69) * 2);
                              puVar87 = (undefined2 *)((long)puVar70 + (8 - uVar104));
                            }
                          }
                          uVar73 = uVar77 * 0xfa0a1f00 + uVar73;
                          uVar68 = (uint)((uVar73 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar76 = uVar68 >> 8;
                          iVar69 = uVar76 * -10000 + (int)uVar73;
                          uVar76 = uVar76 * 0x147b >> 0x13;
                          uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                          *puVar87 = *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                          puVar87[1] = *(undefined2 *)
                                        (digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                          puVar87[2] = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                          puVar87[3] = *(undefined2 *)
                                        (digit_table + (uVar82 * 0x7fffff9c + iVar69) * 2);
                          puVar87 = puVar87 + 4;
                        }
                        *puVar87 = 0x302e;
                        puVar105 = (uint *)(puVar87 + 1);
                        goto LAB_0126a924;
                      }
                    }
                    uVar77 = (ulong)((uint)uVar77 & 1);
                    iVar69 = uVar68 * 0x4d105 + -0x200a5;
                    if (uVar68 == 1 || uVar104 != 0) {
                      iVar69 = uVar68 * 0x4d105;
                    }
                    iVar69 = iVar69 + -0x1439b7ff >> 0x14;
                    uVar80 = *(ulong *)(pow10_sig_table + (ulong)(iVar69 * -2 + 0x2ae) * 8);
                    uVar97 = *(long *)(pow10_sig_table + (ulong)(iVar69 * -2 + 0x2af) * 8) +
                             (ulong)(iVar69 - 1U < 0xffffffc8);
                    bVar101 = ((char)((uint)(iVar69 * -0x3526b) >> 0x10) + (char)uVar68) - 0x32;
                    uVar104 = (ulong)(uVar68 != 1 && uVar104 == 0) + uVar73 * 4 + -2 <<
                              (bVar101 & 0x3f);
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = uVar97;
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = uVar104;
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = SUB168(auVar9 * auVar30,8);
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = uVar80;
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = uVar104;
                    auVar48 = auVar10 * auVar31 + auVar48;
                    uVar104 = uVar73 * 4 << (bVar101 & 0x3f);
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = uVar97;
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = uVar104;
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = SUB168(auVar11 * auVar32,8);
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = uVar80;
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = uVar104;
                    auVar49 = auVar12 * auVar33 + auVar49;
                    uVar93 = auVar49._8_8_;
                    uVar104 = uVar73 * 4 + 2 << (bVar101 & 0x3f);
                    auVar13._8_8_ = 0;
                    auVar13._0_8_ = uVar97;
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = uVar104;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = SUB168(auVar13 * auVar34,8);
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = uVar80;
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = uVar104;
                    auVar50 = auVar14 * auVar35 + auVar50;
                    uVar104 = ((ulong)((auVar48 & (undefined1  [16])0xfffffffffffffffe) !=
                                      (undefined1  [16])0x0) | auVar48._8_8_) + uVar77;
                    uVar77 = ((ulong)((auVar50 & (undefined1  [16])0xfffffffffffffffe) !=
                                     (undefined1  [16])0x0) | auVar50._8_8_) - uVar77;
                    if (uVar93 < 0x28) {
LAB_01268db5:
                      uVar80 = (auVar49 & (undefined1  [16])0xfffffffffffffffe) !=
                               (undefined1  [16])0x0 | uVar93;
                      uVar73 = uVar93 & 0xfffffffffffffffc;
                      bVar109 = true;
                      if (uVar80 <= uVar73 + 2) {
                        bVar109 = (bool)((byte)((uVar93 & 0xffffffff) >> 2) & 0x3f &
                                        uVar80 == uVar73 + 2);
                      }
                      bVar108 = uVar73 + 4 <= uVar77;
                      if (uVar73 < uVar104 == bVar108) {
                        bVar109 = bVar108;
                      }
                      uVar77 = (ulong)bVar109 + (uVar93 >> 2);
                    }
                    else {
                      uVar80 = uVar93 / 0x28;
                      uVar73 = uVar80 * 0x28 + 0x28;
                      if (uVar80 * 0x28 < uVar104 != uVar73 <= uVar77) goto LAB_01268db5;
                      uVar77 = (uVar80 + 1) - (ulong)(uVar77 < uVar73);
                      iVar69 = iVar69 + 1;
                    }
                    iVar61 = (0x11 - (uint)(uVar77 < 10000000000000000)) -
                             (uint)(uVar77 < 1000000000000000);
                    local_38 = lVar62;
                    if (iVar61 + iVar69 + 5U < 0x1b) {
                      uVar68 = iVar61 + iVar69;
                      if ((int)uVar68 < 1) {
                        uVar104 = uVar77 / 100000000;
                        uVar76 = (uint)uVar104;
                        puVar87 = (undefined2 *)
                                  ((long)puVar70 +
                                  (((ulong)(2 - uVar68) + 1) - (ulong)(uVar76 < 100000000)));
                        iVar90 = (int)((uVar104 & 0xffffffff) / 10000);
                        iVar61 = iVar90 * -10000 + uVar76;
                        uVar77 = uVar104 * 0xfa0a1f00 + uVar77;
                        iVar69 = (int)(((uVar104 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar95 = (uint)(iVar69 * 0x29) >> 0xc;
                        uVar91 = uVar95 * -100 + iVar69;
                        uVar82 = iVar69 * -100 + iVar90;
                        *(char *)((long)puVar70 + (ulong)(2 - uVar68)) = (char)uVar95 + '0';
                        uVar104 = (ulong)(uVar91 < 10 && uVar76 < 100000000);
                        *puVar87 = *(undefined2 *)(digit_table + uVar104 + uVar91 * 2);
                        *(undefined2 *)((long)puVar87 + (2 - uVar104)) =
                             *(undefined2 *)(digit_table + uVar82 * 2);
                        iVar69 = (int)uVar77;
                        if (iVar69 == 0) {
                          if (iVar61 == 0) {
                            uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar91];
                            if (uVar82 != 0) {
                              uVar77 = 0;
                            }
                            uVar77 = uVar77 + (byte)dec_trailing_zero_table[uVar82];
                            lVar62 = 4;
                          }
                          else {
                            uVar76 = (uint)(iVar61 * 0x147b) >> 0x13;
                            uVar82 = uVar76 * -100 + iVar61;
                            *(undefined2 *)((long)puVar87 + (4 - uVar104)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                            *(undefined2 *)((long)puVar87 + (6 - uVar104)) =
                                 *(undefined2 *)(digit_table + uVar82 * 2);
                            uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar76] + 2;
                            if (uVar82 != 0) {
                              uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar82];
                            }
                            lVar62 = 8;
                          }
                          uVar77 = lVar62 - uVar77;
                        }
                        else {
                          uVar91 = (uint)(iVar61 * 0x147b) >> 0x13;
                          uVar76 = (uint)((uVar77 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar95 = uVar76 >> 8;
                          uVar82 = uVar95 * 0x147b >> 0x13;
                          uVar77 = (ulong)uVar82;
                          uVar76 = uVar82 * -100 + (uVar76 >> 8);
                          *(undefined2 *)((long)puVar87 + (4 - uVar104)) =
                               *(undefined2 *)(digit_table + (ulong)uVar91 * 2);
                          *(undefined2 *)((long)puVar87 + (6 - uVar104)) =
                               *(undefined2 *)(digit_table + (uVar91 * 0x7fffff9c + iVar61) * 2);
                          *(undefined2 *)((long)puVar87 + (8 - uVar104)) =
                               *(undefined2 *)(digit_table + uVar77 * 2);
                          *(undefined2 *)((long)puVar87 + (10 - uVar104)) =
                               *(undefined2 *)(digit_table + uVar76 * 2);
                          iVar69 = uVar95 * -10000 + iVar69;
                          if (iVar69 == 0) {
                            lVar62 = 0xc;
                          }
                          else {
                            uVar76 = (uint)(iVar69 * 0x147b) >> 0x13;
                            uVar77 = (ulong)uVar76;
                            uVar76 = uVar76 * -100 + iVar69;
                            *(undefined2 *)((long)puVar87 + (0xc - uVar104)) =
                                 *(undefined2 *)(digit_table + uVar77 * 2);
                            *(undefined2 *)((long)puVar87 + (0xe - uVar104)) =
                                 *(undefined2 *)(digit_table + uVar76 * 2);
                            lVar62 = 0x10;
                          }
                          uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar77] + 2;
                          if (uVar76 != 0) {
                            uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar76];
                          }
                          uVar77 = lVar62 - uVar77;
                        }
                        puVar105 = (uint *)((long)puVar87 + ((uVar77 & 0xffffffff) - uVar104));
                        *(undefined2 *)puVar70 = 0x2e30;
                        if ((int)uVar68 < 0) {
                          uVar76 = -uVar68;
                          if ((int)-uVar68 < 2) {
                            uVar76 = 1;
                          }
                          switchD_00570541::default
                                    ((undefined2 *)((long)puVar70 + 2),0x30,(ulong)uVar76);
                        }
                      }
                      else {
                        uVar104 = uVar77 / 100000000;
                        uVar76 = (uint)uVar104;
                        puVar87 = (undefined2 *)((long)puVar70 + (2 - (ulong)(uVar76 < 100000000)));
                        iVar90 = (int)((uVar104 & 0xffffffff) / 10000);
                        iVar61 = iVar90 * -10000 + uVar76;
                        uVar77 = uVar104 * 0xfa0a1f00 + uVar77;
                        iVar69 = (int)(((uVar104 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar95 = (uint)(iVar69 * 0x29) >> 0xc;
                        uVar91 = uVar95 * -100 + iVar69;
                        uVar82 = iVar69 * -100 + iVar90;
                        *puVar70 = 0x3030303030303030;
                        puVar70[1] = 0x3030303030303030;
                        puVar70[2] = 0x3030303030303030;
                        *(char *)((long)puVar70 + 1) = (char)uVar95 + '0';
                        uVar104 = (ulong)(uVar91 < 10 && uVar76 < 100000000);
                        *puVar87 = *(undefined2 *)(digit_table + uVar104 + uVar91 * 2);
                        *(undefined2 *)((long)puVar87 + (2 - uVar104)) =
                             *(undefined2 *)(digit_table + uVar82 * 2);
                        iVar69 = (int)uVar77;
                        if (iVar69 == 0) {
                          if (iVar61 == 0) {
                            uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar91];
                            if (uVar82 != 0) {
                              uVar77 = 0;
                            }
                            uVar77 = uVar77 + (byte)dec_trailing_zero_table[uVar82];
                            lVar57 = 4;
                          }
                          else {
                            uVar76 = (uint)(iVar61 * 0x147b) >> 0x13;
                            uVar82 = uVar76 * -100 + iVar61;
                            *(undefined2 *)((long)puVar87 + (4 - uVar104)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                            *(undefined2 *)((long)puVar87 + (6 - uVar104)) =
                                 *(undefined2 *)(digit_table + uVar82 * 2);
                            uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar76] + 2;
                            if (uVar82 != 0) {
                              uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar82];
                            }
                            lVar57 = 8;
                          }
                          uVar77 = lVar57 - uVar77;
                        }
                        else {
                          uVar91 = (uint)(iVar61 * 0x147b) >> 0x13;
                          uVar76 = (uint)((uVar77 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar95 = uVar76 >> 8;
                          uVar82 = uVar95 * 0x147b >> 0x13;
                          uVar77 = (ulong)uVar82;
                          uVar76 = uVar82 * -100 + (uVar76 >> 8);
                          *(undefined2 *)((long)puVar87 + (4 - uVar104)) =
                               *(undefined2 *)(digit_table + (ulong)uVar91 * 2);
                          *(undefined2 *)((long)puVar87 + (6 - uVar104)) =
                               *(undefined2 *)(digit_table + (uVar91 * 0x7fffff9c + iVar61) * 2);
                          *(undefined2 *)((long)puVar87 + (8 - uVar104)) =
                               *(undefined2 *)(digit_table + uVar77 * 2);
                          *(undefined2 *)((long)puVar87 + (10 - uVar104)) =
                               *(undefined2 *)(digit_table + uVar76 * 2);
                          iVar69 = uVar95 * -10000 + iVar69;
                          if (iVar69 == 0) {
                            lVar57 = 0xc;
                          }
                          else {
                            uVar76 = (uint)(iVar69 * 0x147b) >> 0x13;
                            uVar77 = (ulong)uVar76;
                            uVar76 = uVar76 * -100 + iVar69;
                            *(undefined2 *)((long)puVar87 + (0xc - uVar104)) =
                                 *(undefined2 *)(digit_table + uVar77 * 2);
                            *(undefined2 *)((long)puVar87 + (0xe - uVar104)) =
                                 *(undefined2 *)(digit_table + uVar76 * 2);
                            lVar57 = 0x10;
                          }
                          uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar77] + 2;
                          if (uVar76 != 0) {
                            uVar77 = (ulong)(byte)dec_trailing_zero_table[uVar76];
                          }
                          uVar77 = lVar57 - uVar77;
                        }
                        puVar103 = (uint *)((long)puVar87 + ((uVar77 & 0xffffffff) - uVar104));
                        uVar77 = 1;
                        if (1 < (int)uVar68) {
                          uVar77 = (ulong)uVar68;
                        }
                        uVar104 = 0;
                        do {
                          *(byte *)((long)puVar105 + uVar104 + lVar62) =
                               *(byte *)((long)puVar105 + uVar104 + lVar62 + 1);
                          uVar104 = uVar104 + 1;
                        } while (uVar77 != uVar104);
                        puVar105 = (uint *)((undefined1 *)((ulong)uVar68 + (long)puVar70) + 2);
                        *(undefined1 *)((ulong)uVar68 + (long)puVar70) = 0x2e;
                        if (puVar105 < puVar103) {
                          puVar105 = puVar103;
                        }
                      }
                    }
                    else {
                      uVar104 = uVar77 / 100000000;
                      uVar68 = (uint)uVar104;
                      lVar62 = 2 - (ulong)(uVar68 < 100000000);
                      iVar83 = (int)((uVar104 & 0xffffffff) / 10000);
                      iVar81 = iVar83 * -10000 + uVar68;
                      uVar77 = uVar104 * 0xfa0a1f00 + uVar77;
                      iVar90 = (int)(((uVar104 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar76 = (uint)(iVar90 * 0x29) >> 0xc;
                      uVar91 = uVar76 * -100 + iVar90;
                      uVar82 = iVar90 * -100 + iVar83;
                      *(char *)((long)puVar70 + 1) = (char)uVar76 + '0';
                      uVar104 = (ulong)(uVar91 < 10 && uVar68 < 100000000);
                      *(undefined2 *)((long)puVar70 + lVar62) =
                           *(undefined2 *)(digit_table + uVar104 + uVar91 * 2);
                      lVar62 = lVar62 - uVar104;
                      *(undefined2 *)((long)puVar70 + lVar62 + 2) =
                           *(undefined2 *)(digit_table + uVar82 * 2);
                      iVar90 = (int)uVar77;
                      if (iVar90 == 0) {
                        if (iVar81 == 0) {
                          uVar68 = (uint)(byte)dec_trailing_zero_table[uVar91];
                          if (uVar82 != 0) {
                            uVar68 = 0;
                          }
                          uVar68 = uVar68 + (byte)dec_trailing_zero_table[uVar82];
                          iVar90 = 4;
                        }
                        else {
                          uVar68 = (uint)(iVar81 * 0x147b) >> 0x13;
                          uVar76 = uVar68 * -100 + iVar81;
                          *(undefined2 *)((long)puVar70 + lVar62 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                          *(undefined2 *)((long)puVar70 + lVar62 + 6) =
                               *(undefined2 *)(digit_table + uVar76 * 2);
                          uVar68 = (byte)dec_trailing_zero_table[uVar68] + 2;
                          if (uVar76 != 0) {
                            uVar68 = (uint)(byte)dec_trailing_zero_table[uVar76];
                          }
                          iVar90 = 8;
                        }
                        uVar68 = iVar90 - uVar68;
                      }
                      else {
                        uVar91 = (uint)(iVar81 * 0x147b) >> 0x13;
                        uVar68 = (uint)((uVar77 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar95 = uVar68 >> 8;
                        uVar82 = uVar95 * 0x147b >> 0x13;
                        uVar76 = uVar82 * -100 + (uVar68 >> 8);
                        *(undefined2 *)((long)puVar70 + lVar62 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar91 * 2);
                        *(undefined2 *)((long)puVar70 + lVar62 + 6) =
                             *(undefined2 *)(digit_table + (uVar91 * 0x7fffff9c + iVar81) * 2);
                        *(undefined2 *)((long)puVar70 + lVar62 + 8) =
                             *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                        *(undefined2 *)((long)puVar70 + lVar62 + 10) =
                             *(undefined2 *)(digit_table + uVar76 * 2);
                        iVar90 = uVar95 * -10000 + iVar90;
                        if (iVar90 == 0) {
                          uVar68 = (byte)dec_trailing_zero_table[uVar82] + 2;
                          if (uVar76 != 0) {
                            uVar68 = (uint)(byte)dec_trailing_zero_table[uVar76];
                          }
                          iVar90 = 0xc;
                        }
                        else {
                          uVar68 = (uint)(iVar90 * 0x147b) >> 0x13;
                          uVar76 = uVar68 * -100 + iVar90;
                          *(undefined2 *)((long)puVar70 + lVar62 + 0xc) =
                               *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                          *(undefined2 *)((long)puVar70 + lVar62 + 0xe) =
                               *(undefined2 *)(digit_table + uVar76 * 2);
                          uVar68 = (byte)dec_trailing_zero_table[uVar68] + 2;
                          if (uVar76 != 0) {
                            uVar68 = (uint)(byte)dec_trailing_zero_table[uVar76];
                          }
                          iVar90 = 0x10;
                        }
                        uVar68 = iVar90 - uVar68;
                      }
                      puVar87 = (undefined2 *)
                                ((long)puVar70 +
                                (((ulong)uVar68 + lVar62) - (ulong)((ulong)uVar68 + lVar62 == 2)));
                      uVar76 = (iVar61 + iVar69) - 1;
                      *(undefined1 *)puVar70 = *(undefined1 *)((long)puVar70 + 1);
                      *(undefined1 *)((long)puVar70 + 1) = 0x2e;
                      *puVar87 = 0x2d65;
                      uVar82 = uVar76 >> 0x1f;
                      pcVar60 = (char *)((long)puVar87 + (ulong)uVar82 + 1);
                      uVar68 = -uVar76;
                      if (0 < (int)uVar76) {
                        uVar68 = uVar76;
                      }
                      if (uVar68 < 100) {
                        *(undefined2 *)pcVar60 =
                             *(undefined2 *)(digit_table + (ulong)(uVar68 < 10) + (ulong)uVar68 * 2)
                        ;
                        puVar105 = (uint *)(pcVar60 + (2 - (ulong)(uVar68 < 10)));
                      }
                      else {
                        *pcVar60 = (char)(uVar68 * 0x290 >> 0x10) + '0';
                        *(undefined2 *)((long)puVar87 + (ulong)uVar82 + 2) =
                             *(undefined2 *)
                              (digit_table + ((uVar68 * 0x290 >> 0x10) * 0x7fffff9c + uVar68) * 2);
                        puVar105 = (uint *)((long)puVar87 + (ulong)uVar82 + 4);
                      }
                    }
                  }
                }
              }
LAB_0126a924:
              if (puVar105 != (uint *)0x0) {
                *(ushort *)puVar105 = 0xa2c;
                puVar105 = (uint *)((long)puVar105 + 2);
                goto LAB_0126a93a;
              }
LAB_0126d5c2:
              if (dat_len != (usize *)0x0) {
                *dat_len = 0;
              }
              pyVar65 = &local_48;
              if (err != (yyjson_write_err *)0x0) {
                pyVar65 = err;
              }
              pyVar66->code = 4;
              pcVar60 = "nan or inf number is not allowed";
              goto LAB_0126d4f8;
            }
            if (((uint)uVar104 & 7) == 5) {
              uVar73 = uVar104 >> 8;
              puVar103 = (uint *)(pyVar85->uni).str;
              uVar77 = uVar75;
              if ((local_c0 & uVar68) != 0) {
                uVar77 = 0x10;
              }
              uVar77 = uVar77 + uVar73 * 6;
              if (puVar89 <= (ulong *)((long)puVar105 + uVar77)) {
                uVar80 = sVar107 >> 1;
                if (sVar107 >> 1 <= uVar77) {
                  uVar80 = uVar77;
                }
                sVar63 = (uVar80 + 0xf & 0xfffffffffffffff0) + sVar107;
                pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,sVar63);
                if (pbVar79 == (byte *)0x0) goto LAB_0126d51f;
                puVar88 = (ulong *)(pbVar79 + (sVar63 - ((long)local_88 - (long)puVar89)));
                memmove(puVar88,pbVar79 + ((long)puVar89 - (long)local_f8),
                        (long)local_88 - (long)puVar89);
                puVar105 = (uint *)(pbVar79 + ((long)puVar105 - (long)local_f8));
                local_88 = (ulong *)(pbVar79 + sVar63);
                local_f8 = pbVar79;
              }
              lVar62 = lVar78;
              puVar74 = puVar105;
              if (lVar78 != 0 && (local_c0 & uVar68) == 0) {
                do {
                  puVar105 = (uint *)((long)puVar74 + lVar99);
                  *puVar74 = 0x20202020;
                  lVar62 = lVar62 + -1;
                  puVar74 = puVar105;
                } while (lVar62 != 0);
              }
              if ((puVar98 != enc_table_cpy) || ((pyVar85->tag & 0x18) == 0)) {
                puVar74 = (uint *)(uVar73 + (long)puVar103);
                *(byte *)puVar105 = 0x22;
LAB_01268e10:
                lVar62 = (long)puVar74 - (long)puVar103;
                if (0xf < lVar62) {
                  lVar57 = 0;
                  do {
                    puVar106 = (uint *)((long)puVar105 + lVar57 + 1);
                    puVar86 = (uint *)(lVar57 + (long)puVar103);
                    if (puVar98[*(byte *)((long)puVar103 + lVar57)] != '\0') goto LAB_01269261;
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 1)] != '\0') {
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 1);
                      puVar86 = (uint *)((long)puVar103 + lVar57);
                      goto LAB_01269024;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 2)] != '\0') {
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 1);
                      puVar86 = (uint *)((long)puVar103 + lVar57);
                      goto LAB_0126904b;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 3)] != '\0') {
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 1);
                      puVar86 = (uint *)((long)puVar103 + lVar57);
                      goto LAB_01269076;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 4)] != '\0') {
                      puVar86 = (uint *)((byte *)(lVar57 + (long)puVar103) + 4);
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 5);
                      *(undefined4 *)((long)puVar105 + lVar57 + 1) =
                           *(undefined4 *)(lVar57 + (long)puVar103);
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 5)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 5);
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 6);
                      *(byte *)((long)puVar106 + -1) = pbVar79[4];
                      *(undefined4 *)((long)puVar106 + -5) = *(undefined4 *)pbVar79;
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 6)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 6);
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 7);
                      *(ushort *)((long)puVar106 + -2) = *(ushort *)(pbVar79 + 4);
                      *(undefined4 *)((long)puVar106 + -6) = *(undefined4 *)pbVar79;
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 7)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 7);
                      uVar3 = *(undefined4 *)pbVar79;
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 8);
                      *(undefined4 *)((long)puVar105 + lVar57 + 4) = *(undefined4 *)(pbVar79 + 3);
                      *(undefined4 *)((long)puVar105 + lVar57 + 1) = uVar3;
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 8)] != '\0') {
                      puVar86 = (uint *)((byte *)(lVar57 + (long)puVar103) + 8);
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 9);
                      *(undefined8 *)((long)puVar105 + lVar57 + 1) =
                           *(undefined8 *)(lVar57 + (long)puVar103);
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 9)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 9);
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 10);
                      *(byte *)((long)puVar106 + -1) = pbVar79[8];
                      *(undefined8 *)((long)puVar106 + -9) = *(undefined8 *)pbVar79;
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 10)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 10);
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 0xb);
                      *(ushort *)((long)puVar106 + -2) = *(ushort *)(pbVar79 + 8);
                      *(undefined8 *)((long)puVar106 + -10) = *(undefined8 *)pbVar79;
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 0xb)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 0xb);
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 0xc);
                      puVar106[-1] = *(uint *)(pbVar79 + 7);
                      *(undefined8 *)((long)puVar106 + -0xb) = *(undefined8 *)pbVar79;
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 0xc)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 0xc);
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 0xd);
                      puVar106[-1] = *(uint *)(pbVar79 + 8);
                      *(undefined8 *)(puVar106 + -3) = *(undefined8 *)pbVar79;
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 0xd)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 0xd);
                      uVar71 = *(undefined8 *)pbVar79;
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 0xe);
                      *(undefined8 *)((long)puVar105 + lVar57 + 6) = *(undefined8 *)(pbVar79 + 5);
                      *(undefined8 *)((long)puVar105 + lVar57 + 1) = uVar71;
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 0xe)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 0xe);
                      uVar71 = *(undefined8 *)pbVar79;
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 0xf);
                      *(undefined8 *)((long)puVar105 + lVar57 + 7) = *(undefined8 *)(pbVar79 + 6);
                      *(undefined8 *)((long)puVar105 + lVar57 + 1) = uVar71;
                      goto LAB_01269261;
                    }
                    if (puVar98[*(byte *)((long)puVar103 + lVar57 + 0xf)] != '\0') {
                      pbVar79 = (byte *)(lVar57 + (long)puVar103);
                      puVar86 = (uint *)(pbVar79 + 0xf);
                      uVar71 = *(undefined8 *)pbVar79;
                      puVar106 = (uint *)((long)puVar105 + lVar57 + 0x10);
                      *(undefined8 *)((long)puVar105 + lVar57 + 8) = *(undefined8 *)(pbVar79 + 7);
                      *(undefined8 *)((long)puVar105 + lVar57 + 1) = uVar71;
                      goto LAB_01269261;
                    }
                    uVar71 = *(undefined8 *)(puVar86 + 2);
                    *(undefined8 *)puVar106 = *(undefined8 *)puVar86;
                    *(undefined8 *)((long)puVar105 + lVar57 + 9) = uVar71;
                    lVar57 = lVar57 + 0x10;
                    lVar62 = lVar62 + -0x10;
                  } while (0xf < lVar62);
                  puVar105 = (uint *)((long)puVar105 + lVar57);
                  puVar103 = (uint *)((long)puVar103 + lVar57);
                }
                puVar106 = (uint *)((long)puVar105 + 1);
                puVar86 = puVar103;
                for (lVar62 = (long)puVar74 - (long)puVar103; 3 < lVar62; lVar62 = lVar62 + -4) {
                  if (puVar98[(byte)*puVar86] != '\0') goto LAB_01269261;
                  if (puVar98[*(byte *)((long)puVar86 + 1)] != '\0') goto LAB_01269024;
                  if (puVar98[*(byte *)((long)puVar86 + 2)] != '\0') goto LAB_0126904b;
                  if (puVar98[*(byte *)((long)puVar86 + 3)] != '\0') goto LAB_01269076;
                  *puVar106 = *puVar86;
                  puVar106 = puVar106 + 1;
                  puVar86 = puVar86 + 1;
                }
                while( true ) {
                  if (puVar74 <= puVar86) goto switchD_01269289_default;
                  uVar76 = *puVar86;
                  if (puVar98[(byte)uVar76] != '\0') break;
                  puVar86 = (uint *)((long)puVar86 + 1);
                  *(byte *)puVar106 = (byte)uVar76;
                  puVar106 = (uint *)((long)puVar106 + 1);
                }
                goto LAB_01269261;
              }
              *(byte *)puVar105 = 0x22;
              puVar105 = (uint *)((long)puVar105 + 1);
              if (0xfff < uVar104) {
                do {
                  uVar71 = *(undefined8 *)(puVar103 + 2);
                  *(undefined8 *)puVar105 = *(undefined8 *)puVar103;
                  *(undefined8 *)(puVar105 + 2) = uVar71;
                  puVar105 = puVar105 + 4;
                  puVar103 = puVar103 + 4;
                  uVar73 = uVar73 - 0x10;
                } while (0xf < uVar73);
              }
              for (; 3 < uVar73; uVar73 = uVar73 - 4) {
                *puVar105 = *puVar103;
                puVar105 = puVar105 + 1;
                puVar103 = puVar103 + 1;
              }
              if (uVar73 != 0) {
                uVar77 = 0;
                do {
                  *(byte *)((long)puVar105 + uVar77) = *(byte *)((long)puVar103 + uVar77);
                  uVar77 = uVar77 + 1;
                } while (uVar73 != uVar77);
                puVar105 = (uint *)((long)puVar105 + uVar77);
              }
              *(byte *)puVar105 = 0x22;
              pbVar79 = (byte *)((long)puVar105 + 1);
              goto LAB_0126a50f;
            }
            if ((~(byte)uVar104 & 6) != 0) {
              if (bVar101 == 1) {
                uVar104 = uVar104 >> 8;
                pvVar8 = (pyVar85->uni).ptr;
                if (puVar89 <= (ulong *)((long)puVar105 + uVar104 + 3)) {
                  uVar77 = sVar107 >> 1;
                  if (sVar107 >> 1 <= uVar104 + 3) {
                    uVar77 = uVar104 + 3;
                  }
                  sVar63 = (uVar77 + 0xf & 0xfffffffffffffff0) + sVar107;
                  pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,sVar63);
                  if (pbVar79 == (byte *)0x0) goto LAB_0126d51f;
                  sVar72 = (long)local_88 - (long)puVar89;
                  memmove(pbVar79 + (sVar63 - sVar72),pbVar79 + ((long)puVar89 - (long)local_f8),
                          sVar72);
                  puVar105 = (uint *)(pbVar79 + ((long)puVar105 - (long)local_f8));
                  local_88 = (ulong *)(pbVar79 + sVar63);
                  puVar89 = (ulong *)(pbVar79 + (sVar63 - sVar72));
                  local_f8 = pbVar79;
                }
                switchD_00b1522a::default(puVar105,pvVar8,uVar104);
                pbVar79 = (byte *)((long)puVar105 + uVar104);
                puVar105 = (uint *)(pbVar79 + 2);
                pbVar79[0] = 0x2c;
                pbVar79[1] = 10;
                puVar88 = puVar89;
              }
              else if (bVar101 == 2) {
                uVar77 = uVar75;
                if ((uVar68 & local_c0) != 0) {
                  uVar77 = 0x10;
                }
                if (puVar89 <= (ulong *)((long)puVar105 + uVar77)) {
                  uVar104 = sVar107 >> 1;
                  if (sVar107 >> 1 <= uVar77) {
                    uVar104 = uVar77;
                  }
                  sVar63 = (uVar104 + 0xf & 0xfffffffffffffff0) + sVar107;
                  pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,sVar63);
                  if (pbVar79 == (byte *)0x0) goto LAB_0126d51f;
                  puVar88 = (ulong *)(pbVar79 + (sVar63 - ((long)local_88 - (long)puVar89)));
                  memmove(puVar88,pbVar79 + ((long)puVar89 - (long)local_f8),
                          (long)local_88 - (long)puVar89);
                  puVar105 = (uint *)(pbVar79 + ((long)puVar105 - (long)local_f8));
                  local_88 = (ulong *)(pbVar79 + sVar63);
                  local_f8 = pbVar79;
                }
                lVar62 = lVar78;
                puVar103 = puVar105;
                if (lVar78 != 0 && (uVar68 & local_c0) == 0) {
                  do {
                    puVar105 = (uint *)((long)puVar103 + lVar99);
                    *puVar103 = 0x20202020;
                    lVar62 = lVar62 + -1;
                    puVar103 = puVar105;
                  } while (lVar62 != 0);
                }
                puVar105[0] = 0x6c6c756e;
                puVar105[1] = 0xa2c;
                puVar105 = (uint *)((long)puVar105 + 6);
              }
              else {
                if (bVar101 != 3) goto LAB_0126d4be;
                uVar77 = uVar75;
                if ((uVar68 & local_c0) != 0) {
                  uVar77 = 0x10;
                }
                if (puVar89 <= (ulong *)((long)puVar105 + uVar77)) {
                  uVar104 = sVar107 >> 1;
                  if (sVar107 >> 1 <= uVar77) {
                    uVar104 = uVar77;
                  }
                  sVar63 = (uVar104 + 0xf & 0xfffffffffffffff0) + sVar107;
                  pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,sVar63);
                  if (pbVar79 == (byte *)0x0) goto LAB_0126d51f;
                  puVar88 = (ulong *)(pbVar79 + (sVar63 - ((long)local_88 - (long)puVar89)));
                  memmove(puVar88,pbVar79 + ((long)puVar89 - (long)local_f8),
                          (long)local_88 - (long)puVar89);
                  puVar105 = (uint *)(pbVar79 + ((long)puVar105 - (long)local_f8));
                  local_88 = (ulong *)(pbVar79 + sVar63);
                  local_f8 = pbVar79;
                }
                lVar62 = lVar78;
                puVar103 = puVar105;
                if (lVar78 != 0 && (uVar68 & local_c0) == 0) {
                  do {
                    puVar105 = (uint *)((long)puVar103 + lVar99);
                    *puVar103 = 0x20202020;
                    lVar62 = lVar62 + -1;
                    puVar103 = puVar105;
                  } while (lVar62 != 0);
                }
                bVar109 = (pyVar85->tag & 0x18) != 0;
                uVar71 = 0xa2c65736c6166;
                if (bVar109) {
                  uVar71 = 0xa2c65757274;
                }
                *(undefined8 *)puVar105 = uVar71;
                puVar105 = (uint *)((long)puVar105 + (7 - (ulong)bVar109));
              }
              goto LAB_0126a93a;
            }
            uVar68 = uVar68 & local_c0;
            if (uVar104 < 0x100) {
              uVar77 = uVar75;
              if (uVar68 != 0) {
                uVar77 = 0x10;
              }
              if (puVar89 <= (ulong *)((long)puVar105 + uVar77)) {
                uVar104 = sVar107 >> 1;
                if (sVar107 >> 1 <= uVar77) {
                  uVar104 = uVar77;
                }
                sVar63 = (uVar104 + 0xf & 0xfffffffffffffff0) + sVar107;
                pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,sVar63);
                if (pbVar79 == (byte *)0x0) goto LAB_0126d51f;
                puVar88 = (ulong *)(pbVar79 + (sVar63 - ((long)local_88 - (long)puVar89)));
                memmove(puVar88,pbVar79 + ((long)puVar89 - (long)local_f8),
                        (long)local_88 - (long)puVar89);
                puVar105 = (uint *)(pbVar79 + ((long)puVar105 - (long)local_f8));
                local_88 = (ulong *)(pbVar79 + sVar63);
                local_f8 = pbVar79;
              }
              lVar62 = lVar78;
              puVar103 = puVar105;
              if (lVar78 != 0 && uVar68 == 0) {
                do {
                  puVar105 = (uint *)((long)puVar103 + lVar99);
                  *puVar103 = 0x20202020;
                  lVar62 = lVar62 + -1;
                  puVar103 = puVar105;
                } while (lVar62 != 0);
              }
              bVar101 = (bVar101 == 7) * ' ';
              *(byte *)puVar105 = bVar101 + 0x5b;
              *(byte *)((long)puVar105 + 1) = bVar101 | 0x5d;
              *(ushort *)((long)puVar105 + 2) = 0xa2c;
              puVar105 = puVar105 + 1;
              goto LAB_0126a93a;
            }
            local_90 = (uint *)(ulong)(bVar101 == 7);
            if (uVar68 != 0) {
              uVar94 = 0x20;
            }
            uVar77 = sVar107;
            if (puVar89 <= (ulong *)((long)puVar105 + uVar94)) {
              uVar77 = sVar107 >> 1;
              if (sVar107 >> 1 <= uVar94) {
                uVar77 = uVar94;
              }
              uVar77 = (uVar77 + 0xf & 0xfffffffffffffff0) + sVar107;
              pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,uVar77);
              if (pbVar79 == (byte *)0x0) goto LAB_0126d51f;
              puVar88 = (ulong *)(pbVar79 + (uVar77 - ((long)local_88 - (long)puVar89)));
              memmove(puVar88,pbVar79 + ((long)puVar89 - (long)local_f8),
                      (long)local_88 - (long)puVar89);
              puVar105 = (uint *)(pbVar79 + ((long)puVar105 - (long)local_f8));
              local_88 = (ulong *)(pbVar79 + uVar77);
              local_f8 = pbVar79;
            }
            puVar88[-2] = uVar64 + lVar92 * 2;
            lVar92 = (uVar104 >> 8) << (bVar101 == 7);
            puVar88[-1] = (ulong)local_80;
            lVar62 = lVar78;
            puVar103 = puVar105;
            if (lVar78 != 0 && uVar68 == 0) {
              do {
                puVar105 = (uint *)((long)puVar103 + lVar99);
                *puVar103 = 0x20202020;
                lVar62 = lVar62 + -1;
                puVar103 = puVar105;
              } while (lVar62 != 0);
            }
            *(byte *)puVar105 = (bVar101 == 7) << 5 | 0x5b;
            *(byte *)((long)puVar105 + 1) = 10;
            uVar58 = (pyVar85->uni).u64;
            if (bVar101 == 7) {
              uVar58 = *(uint64_t *)(uVar58 + 0x10);
            }
            puVar88 = puVar88 + -2;
            lVar78 = lVar78 + 1;
            puVar105 = (uint *)((long)puVar105 + 2);
            pyVar84 = *(yyjson_mut_val **)(uVar58 + 0x10);
            local_80 = pyVar85;
          } while( true );
        }
        local_f8 = (byte *)0x0;
LAB_0126d51f:
        if (dat_len != (usize *)0x0) {
          *dat_len = 0;
        }
        pyVar65 = &local_48;
        if (err != (yyjson_write_err *)0x0) {
          pyVar65 = err;
        }
        pyVar66->code = 2;
        pyVar65->msg = "memory allocation failed";
      }
      if (local_f8 != (byte *)0x0) {
        (*p_Var5)(pvVar6,local_f8);
      }
      goto LAB_0126d975;
    }
    if ((flg & 2) != 0) {
      puVar102 = enc_table_esc_slash;
      if ((flg & 4) == 0) {
        puVar102 = enc_table_esc;
      }
      switch(bVar101 & 7) {
      case 1:
        goto switchD_012687f5_caseD_1;
      case 2:
        goto switchD_012687f5_caseD_2;
      case 3:
        goto switchD_012687f5_caseD_3;
      case 4:
        goto switchD_012687f5_caseD_4;
      case 5:
        goto switchD_012687f5_caseD_5;
      case 6:
        goto switchD_012687f5_caseD_6;
      case 7:
        goto switchD_012687f5_caseD_7;
      }
switchD_012687f5_caseD_0:
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar65 = &local_48;
      if (err != (yyjson_write_err *)0x0) {
        pyVar65 = err;
      }
      pyVar66->code = 3;
      pyVar65->msg = "invalid JSON value type";
      goto LAB_0126d975;
    }
    puVar102 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar102 = enc_table_cpy;
    }
    switch(bVar101 & 7) {
    case 0:
      goto switchD_012687f5_caseD_0;
    case 1:
switchD_012687f5_caseD_1:
      uVar77 = uVar77 >> 8;
      pvVar8 = (val->uni).ptr;
      puVar105 = (uint *)(*p_Var4)(pvVar6,uVar77 + 2);
      if (puVar105 == (uint *)0x0) break;
      switchD_00b1522a::default(puVar105,pvVar8,uVar77);
      local_70 = (uint *)((long)puVar105 + uVar77);
      goto LAB_0126d90a;
    case 2:
switchD_012687f5_caseD_2:
      puVar105 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar105 != (uint *)0x0) {
        puVar105[0] = 0x6c6c756e;
        puVar105[1] = 0xa2c;
        local_70 = puVar105 + 1;
        goto LAB_0126d90a;
      }
      break;
    case 3:
switchD_012687f5_caseD_3:
      puVar105 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar105 != (uint *)0x0) {
        bVar109 = (val->tag & 0x18) != 0;
        uVar71 = 0xa2c65736c6166;
        if (bVar109) {
          uVar71 = 0xa2c65757274;
        }
        *(undefined8 *)puVar105 = uVar71;
        local_70 = (uint *)((long)puVar105 + (5 - (ulong)bVar109));
        goto LAB_0126d90a;
      }
      break;
    case 4:
switchD_012687f5_caseD_4:
      puVar105 = (uint *)(*p_Var4)(pvVar6,0x22);
      if (puVar105 == (uint *)0x0) break;
      uVar77 = (val->uni).u64;
      uVar68 = (uint)(uVar77 >> 0x20);
      if ((val->tag & 0x10) == 0) {
        uVar68 = uVar68 >> 0x1f & (uint)(val->tag >> 3);
        uVar94 = -uVar77;
        if (uVar68 == 0) {
          uVar94 = uVar77;
        }
        *(byte *)puVar105 = 0x2d;
        pbVar79 = (byte *)((long)puVar105 + (ulong)uVar68);
        if (uVar94 < 100000000) {
          if (uVar94 < 100) {
            *(undefined2 *)pbVar79 =
                 *(undefined2 *)(digit_table + (ulong)(uVar94 < 10) + uVar94 * 2);
            pbVar79 = pbVar79 + -(ulong)(uVar94 < 10);
LAB_0126f442:
            local_70 = (uint *)(pbVar79 + 2);
          }
          else {
            iVar69 = (int)uVar94;
            if (uVar94 < 10000) {
              uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
              uVar77 = (ulong)(uVar94 < 1000);
              *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + uVar77 + (ulong)uVar68 * 2);
              *(undefined2 *)(pbVar79 + (2 - uVar77)) =
                   *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
              local_70 = (uint *)(pbVar79 + (4 - uVar77));
            }
            else {
              if (999999 < uVar94) {
                uVar68 = (uint)(uVar94 * 0x68db8bb >> 0x20);
                uVar76 = uVar68 >> 8;
                iVar69 = uVar76 * -10000 + iVar69;
                uVar76 = uVar76 * 0x147b >> 0x13;
                uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                iVar69 = uVar82 * -100 + iVar69;
                *(undefined2 *)pbVar79 =
                     *(undefined2 *)(digit_table + (ulong)(uVar94 < 10000000) + (ulong)uVar76 * 2);
                pbVar79 = pbVar79 + -(ulong)(uVar94 < 10000000);
                *(undefined2 *)(pbVar79 + 2) =
                     *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                uVar67 = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                goto LAB_0126f051;
              }
              iVar69 = (int)(uVar94 * 0x68db9 >> 0x20) * -10000 + iVar69;
              uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
              uVar77 = (ulong)(uVar94 < 100000);
              *(undefined2 *)pbVar79 =
                   *(undefined2 *)(digit_table + uVar77 + (uVar94 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar79 + (2 - uVar77)) =
                   *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
              *(undefined2 *)(pbVar79 + (4 - uVar77)) =
                   *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
              local_70 = (uint *)(pbVar79 + (6 - uVar77));
            }
          }
        }
        else {
          uVar77 = uVar94 / 100000000;
          uVar75 = uVar77 * 0xfa0a1f00 + uVar94;
          iVar69 = (int)uVar77;
          if (uVar94 < 10000000000000000) {
            if (uVar94 >> 10 < 0x9502f9) {
              *(undefined2 *)pbVar79 =
                   *(undefined2 *)(digit_table + (ulong)(uVar94 < 1000000000) + uVar77 * 2);
              pbVar79 = pbVar79 + (2 - (ulong)(uVar94 < 1000000000));
            }
            else if (uVar94 >> 0xc < 0xe8d4a51) {
              uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
              uVar77 = (ulong)(uVar94 >> 0xb < 0x2e90edd);
              *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + uVar77 + (ulong)uVar68 * 2);
              *(undefined2 *)(pbVar79 + (2 - uVar77)) =
                   *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
              pbVar79 = pbVar79 + (4 - uVar77);
            }
            else if (uVar94 < 100000000000000) {
              iVar69 = (int)(uVar77 * 0x68db9 >> 0x20) * -10000 + iVar69;
              uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
              uVar94 = (ulong)(uVar94 >> 0xd < 0x48c27395);
              *(undefined2 *)pbVar79 =
                   *(undefined2 *)(digit_table + uVar94 + (uVar77 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar79 + (2 - uVar94)) =
                   *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
              *(undefined2 *)(pbVar79 + (4 - uVar94)) =
                   *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
              pbVar79 = pbVar79 + (6 - uVar94);
            }
            else {
              uVar68 = (uint)(uVar77 * 0x68db8bb >> 0x20);
              uVar76 = uVar68 >> 8;
              iVar69 = uVar76 * -10000 + iVar69;
              uVar76 = uVar76 * 0x147b >> 0x13;
              uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
              uVar77 = (ulong)(uVar94 < 1000000000000000);
              *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + uVar77 + (ulong)uVar76 * 2);
              *(undefined2 *)(pbVar79 + (2 - uVar77)) =
                   *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
              *(undefined2 *)(pbVar79 + (4 - uVar77)) =
                   *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
              *(undefined2 *)(pbVar79 + (6 - uVar77)) =
                   *(undefined2 *)(digit_table + (uVar82 * -100 + iVar69) * 2);
              pbVar79 = pbVar79 + (8 - uVar77);
            }
            uVar68 = (uint)((uVar75 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar76 = uVar68 >> 8;
            iVar69 = uVar76 * -10000 + (int)uVar75;
            uVar76 = uVar76 * 0x147b >> 0x13;
            uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
            iVar69 = uVar82 * 0x7fffff9c + iVar69;
            *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
            *(undefined2 *)(pbVar79 + 2) =
                 *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
            uVar67 = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
LAB_0126f051:
            *(undefined2 *)(pbVar79 + 4) = uVar67;
            *(undefined2 *)(pbVar79 + 6) = *(undefined2 *)(digit_table + (uint)(iVar69 * 2));
            local_70 = (uint *)(pbVar79 + 8);
          }
          else {
            uVar77 = uVar94 / 1000000000000;
            iVar61 = (int)uVar77;
            iVar69 = iVar69 + iVar61 * -10000;
            if (uVar94 < 1000000000000000000) {
              iVar61 = (int)(uVar77 * 0x68db9 >> 0x20) * -10000 + iVar61;
              uVar68 = (uint)(iVar61 * 0x147b) >> 0x13;
              uVar94 = (ulong)(uVar94 < 100000000000000000);
              *(undefined2 *)pbVar79 =
                   *(undefined2 *)(digit_table + uVar94 + (uVar77 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar79 + (2 - uVar94)) =
                   *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
              *(undefined2 *)(pbVar79 + (4 - uVar94)) =
                   *(undefined2 *)(digit_table + (uVar68 * -100 + iVar61) * 2);
              lVar92 = 6 - uVar94;
            }
            else {
              uVar68 = (uint)(uVar77 / 10000);
              iVar61 = uVar68 * -10000 + iVar61;
              uVar68 = uVar68 / 100;
              uVar76 = (uint)(iVar61 * 0x147b) >> 0x13;
              uVar94 = (ulong)(uVar94 < 10000000000000000000);
              *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + uVar94 + (ulong)uVar68 * 2);
              *(undefined2 *)(pbVar79 + (2 - uVar94)) =
                   *(undefined2 *)(digit_table + (uVar68 * -100 + (int)(uVar77 / 10000)) * 2);
              *(undefined2 *)(pbVar79 + (4 - uVar94)) =
                   *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
              *(undefined2 *)(pbVar79 + (6 - uVar94)) =
                   *(undefined2 *)(digit_table + (uVar76 * -100 + iVar61) * 2);
              lVar92 = 8 - uVar94;
            }
            pbVar79 = pbVar79 + lVar92;
            uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
            *(undefined2 *)pbVar79 = *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
            *(undefined2 *)(pbVar79 + 2) =
                 *(undefined2 *)(digit_table + (uVar68 * 0x7fffff9c + iVar69) * 2);
            uVar68 = (uint)((uVar75 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar76 = uVar68 >> 8;
            iVar69 = uVar76 * -10000 + (int)uVar75;
            uVar76 = uVar76 * 0x147b >> 0x13;
            uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
            *(undefined2 *)(pbVar79 + 4) = *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
            *(undefined2 *)(pbVar79 + 6) =
                 *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
            *(undefined2 *)(pbVar79 + 8) = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
            *(undefined2 *)(pbVar79 + 10) =
                 *(undefined2 *)(digit_table + (uVar82 * 0x7fffff9c + iVar69) * 2);
            local_70 = (uint *)(pbVar79 + 0xc);
          }
        }
      }
      else {
        uVar94 = uVar77 & 0xfffffffffffff;
        uVar68 = uVar68 >> 0x14 & 0x7ff;
        if (uVar68 == 0x7ff) {
          if ((flg & 0x10) == 0) {
            if ((flg & 8) == 0) {
              local_70 = (uint *)0x0;
            }
            else if (uVar94 == 0) {
              *(byte *)puVar105 = 0x2d;
              lVar92 = -((long)uVar77 >> 0x3f);
              *(undefined8 *)((long)puVar105 + lVar92) = 0x7974696e69666e49;
              local_70 = (uint *)((long)puVar105 + lVar92 + 8);
            }
            else {
              *puVar105 = 0x4e614e;
              local_70 = (uint *)((long)puVar105 + 3);
            }
          }
          else {
            *puVar105 = 0x6c6c756e;
            local_70 = puVar105 + 1;
          }
        }
        else {
          *(byte *)puVar105 = 0x2d;
          lVar92 = -((long)uVar77 >> 0x3f);
          puVar70 = (undefined8 *)((long)puVar105 + lVar92);
          if ((uVar77 & 0x7fffffffffffffff) == 0) {
            *(undefined4 *)puVar70 = 0x302e30;
            local_70 = (uint *)((long)puVar70 + 3);
          }
          else if (uVar68 == 0) {
            yyjson_mut_write_opts_impl();
          }
          else {
            uVar75 = uVar94 + 0x10000000000000;
            if (uVar68 - 0x3ff < 0x35) {
              lVar99 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
                }
              }
              if (0x433 - uVar68 <= (uint)lVar99) {
                uVar75 = uVar75 >> ((byte)(0x433 - uVar68) & 0x3f);
                iVar69 = (int)uVar75;
                if (uVar75 < 100000000) {
                  if (uVar75 < 100) {
                    *(undefined2 *)puVar70 =
                         *(undefined2 *)(digit_table + (ulong)(uVar75 < 10) + uVar75 * 2);
                    pbVar79 = (byte *)((long)puVar70 + (2 - (ulong)(uVar75 < 10)));
                  }
                  else if (uVar75 < 10000) {
                    uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar77 = (ulong)(uVar75 < 1000);
                    *(undefined2 *)puVar70 =
                         *(undefined2 *)(digit_table + uVar77 + (ulong)uVar68 * 2);
                    *(undefined2 *)((long)puVar70 + (2 - uVar77)) =
                         *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                    pbVar79 = (byte *)((long)puVar70 + (4 - uVar77));
                  }
                  else if (uVar75 < 1000000) {
                    iVar69 = (int)(uVar75 * 0x68db9 >> 0x20) * -10000 + iVar69;
                    uVar68 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar77 = (ulong)(uVar75 < 100000);
                    *(undefined2 *)puVar70 =
                         *(undefined2 *)(digit_table + uVar77 + (uVar75 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)((long)puVar70 + (2 - uVar77)) =
                         *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                    *(undefined2 *)((long)puVar70 + (4 - uVar77)) =
                         *(undefined2 *)(digit_table + (uVar68 * -100 + iVar69) * 2);
                    pbVar79 = (byte *)((long)puVar70 + (6 - uVar77));
                  }
                  else {
                    uVar68 = (uint)(uVar75 * 0x68db8bb >> 0x20);
                    uVar76 = uVar68 >> 8;
                    iVar69 = uVar76 * -10000 + iVar69;
                    uVar76 = uVar76 * 0x147b >> 0x13;
                    uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar77 = (ulong)(uVar75 < 10000000);
                    *(undefined2 *)puVar70 =
                         *(undefined2 *)(digit_table + uVar77 + (ulong)uVar76 * 2);
                    *(undefined2 *)((long)puVar70 + (2 - uVar77)) =
                         *(undefined2 *)(digit_table + (uVar76 * -100 + (uVar68 >> 8)) * 2);
                    *(undefined2 *)((long)puVar70 + (4 - uVar77)) =
                         *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                    *(undefined2 *)((long)puVar70 + (6 - uVar77)) =
                         *(undefined2 *)(digit_table + (uVar82 * -100 + iVar69) * 2);
                    pbVar79 = (byte *)((long)puVar70 + (8 - uVar77));
                  }
                }
                else {
                  auVar29._8_8_ = 0;
                  auVar29._0_8_ = uVar75;
                  uVar77 = SUB168(auVar29 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                  iVar61 = (int)uVar77;
                  uVar68 = iVar61 * -100000000 + iVar69;
                  if (uVar75 >> 10 < 0x9502f9) {
                    *(undefined2 *)puVar70 =
                         *(undefined2 *)(digit_table + (ulong)(uVar75 < 1000000000) + uVar77 * 2);
                    puVar87 = (undefined2 *)((long)puVar70 + (2 - (ulong)(uVar75 < 1000000000)));
                  }
                  else if (uVar75 >> 0xc < 0xe8d4a51) {
                    uVar76 = (uint)(iVar61 * 0x147b) >> 0x13;
                    uVar77 = (ulong)(uVar75 >> 0xb < 0x2e90edd);
                    *(undefined2 *)puVar70 =
                         *(undefined2 *)(digit_table + uVar77 + (ulong)uVar76 * 2);
                    *(undefined2 *)((long)puVar70 + (2 - uVar77)) =
                         *(undefined2 *)(digit_table + (uVar76 * -100 + iVar61) * 2);
                    puVar87 = (undefined2 *)((long)puVar70 + (4 - uVar77));
                  }
                  else if (uVar75 < 100000000000000) {
                    iVar61 = (int)(uVar77 * 0x68db9 >> 0x20) * -10000 + iVar61;
                    uVar76 = (uint)(iVar61 * 0x147b) >> 0x13;
                    uVar94 = (ulong)(uVar75 >> 0xd < 0x48c27395);
                    *(undefined2 *)puVar70 =
                         *(undefined2 *)(digit_table + uVar94 + (uVar77 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)((long)puVar70 + (2 - uVar94)) =
                         *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                    *(undefined2 *)((long)puVar70 + (4 - uVar94)) =
                         *(undefined2 *)(digit_table + (uVar76 * -100 + iVar61) * 2);
                    puVar87 = (undefined2 *)((long)puVar70 + (6 - uVar94));
                  }
                  else {
                    uVar76 = (uint)(uVar77 * 0x68db8bb >> 0x20);
                    uVar82 = uVar76 >> 8;
                    iVar61 = uVar82 * -10000 + iVar61;
                    uVar82 = uVar82 * 0x147b >> 0x13;
                    uVar91 = (uint)(iVar61 * 0x147b) >> 0x13;
                    uVar77 = (ulong)(uVar75 < 1000000000000000);
                    *(undefined2 *)puVar70 =
                         *(undefined2 *)(digit_table + uVar77 + (ulong)uVar82 * 2);
                    *(undefined2 *)((long)puVar70 + (2 - uVar77)) =
                         *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar76 >> 8)) * 2);
                    *(undefined2 *)((long)puVar70 + (4 - uVar77)) =
                         *(undefined2 *)(digit_table + (ulong)uVar91 * 2);
                    *(undefined2 *)((long)puVar70 + (6 - uVar77)) =
                         *(undefined2 *)(digit_table + (uVar91 * -100 + iVar61) * 2);
                    puVar87 = (undefined2 *)((long)puVar70 + (8 - uVar77));
                  }
                  uVar76 = (uint)((ulong)uVar68 * 0x68db8bb >> 0x20);
                  uVar82 = uVar76 >> 8;
                  iVar69 = uVar82 * -10000 + uVar68;
                  uVar68 = uVar82 * 0x147b >> 0x13;
                  uVar82 = (uint)(iVar69 * 0x147b) >> 0x13;
                  *puVar87 = *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                  puVar87[1] = *(undefined2 *)(digit_table + (uVar68 * -100 + (uVar76 >> 8)) * 2);
                  puVar87[2] = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                  puVar87[3] = *(undefined2 *)(digit_table + (uVar82 * 0x7fffff9c + iVar69) * 2);
                  pbVar79 = (byte *)(puVar87 + 4);
                }
                pbVar79[0] = 0x2e;
                pbVar79[1] = 0x30;
                goto LAB_0126f442;
              }
            }
            uVar77 = (ulong)((uint)uVar77 & 1);
            iVar69 = uVar68 * 0x4d105 + -0x200a5;
            if (uVar68 == 1 || uVar94 != 0) {
              iVar69 = uVar68 * 0x4d105;
            }
            iVar69 = iVar69 + -0x1439b7ff >> 0x14;
            uVar64 = *(ulong *)(pow10_sig_table + (ulong)(iVar69 * -2 + 0x2ae) * 8);
            uVar104 = *(long *)(pow10_sig_table + (ulong)(iVar69 * -2 + 0x2af) * 8) +
                      (ulong)(iVar69 - 1U < 0xffffffc8);
            bVar101 = ((char)((uint)(iVar69 * -0x3526b) >> 0x10) + (char)uVar68) - 0x32;
            uVar94 = (ulong)(uVar68 != 1 && uVar94 == 0) + uVar75 * 4 + -2 << (bVar101 & 0x3f);
            auVar23._8_8_ = 0;
            auVar23._0_8_ = uVar104;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar94;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = SUB168(auVar23 * auVar42,8);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = uVar64;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar94;
            auVar54 = auVar24 * auVar43 + auVar54;
            uVar94 = uVar75 * 4 << (bVar101 & 0x3f);
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar104;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar94;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = SUB168(auVar25 * auVar44,8);
            auVar26._8_8_ = 0;
            auVar26._0_8_ = uVar64;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar94;
            auVar55 = auVar26 * auVar45 + auVar55;
            uVar94 = auVar55._8_8_;
            uVar75 = uVar75 * 4 + 2 << (bVar101 & 0x3f);
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar104;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar75;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = SUB168(auVar27 * auVar46,8);
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar64;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar75;
            auVar56 = auVar28 * auVar47 + auVar56;
            uVar75 = ((ulong)((auVar54 & (undefined1  [16])0xfffffffffffffffe) !=
                             (undefined1  [16])0x0) | auVar54._8_8_) + uVar77;
            uVar77 = ((ulong)((auVar56 & (undefined1  [16])0xfffffffffffffffe) !=
                             (undefined1  [16])0x0) | auVar56._8_8_) - uVar77;
            if (uVar94 < 0x28) {
LAB_0126db52:
              uVar104 = (auVar55 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                        uVar94;
              uVar64 = uVar94 & 0xfffffffffffffffc;
              bVar109 = true;
              if (uVar104 <= uVar64 + 2) {
                bVar109 = (bool)((byte)(uVar94 >> 2) & 0x3f & uVar104 == uVar64 + 2);
              }
              bVar108 = uVar64 + 4 <= uVar77;
              if (uVar64 < uVar75 == bVar108) {
                bVar109 = bVar108;
              }
              uVar77 = (uVar94 >> 2) + (ulong)bVar109;
            }
            else {
              uVar104 = uVar94 / 0x28;
              uVar64 = uVar104 * 0x28 + 0x28;
              if (uVar104 * 0x28 < uVar75 != uVar64 <= uVar77) goto LAB_0126db52;
              uVar77 = (uVar104 + 1) - (ulong)(uVar77 < uVar64);
              iVar69 = iVar69 + 1;
            }
            iVar61 = (0x11 - (uint)(uVar77 < 10000000000000000)) - (uint)(uVar77 < 1000000000000000)
            ;
            if (iVar61 + iVar69 + 5U < 0x1b) {
              uVar68 = iVar61 + iVar69;
              if ((int)uVar68 < 1) {
                uVar94 = uVar77 / 100000000;
                uVar82 = (uint)uVar94;
                puVar87 = (undefined2 *)
                          ((long)puVar70 + (((ulong)(2 - uVar68) + 1) - (ulong)(uVar82 < 100000000))
                          );
                iVar90 = (int)((uVar94 & 0xffffffff) / 10000);
                iVar61 = iVar90 * -10000 + uVar82;
                uVar77 = uVar94 * 0xfa0a1f00 + uVar77;
                iVar69 = (int)(((uVar94 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                uVar91 = (uint)(iVar69 * 0x29) >> 0xc;
                uVar95 = uVar91 * -100 + iVar69;
                uVar76 = iVar69 * -100 + iVar90;
                *(char *)((long)puVar70 + (ulong)(2 - uVar68)) = (char)uVar91 + '0';
                uVar94 = (ulong)(uVar95 < 10 && uVar82 < 100000000);
                *puVar87 = *(undefined2 *)(digit_table + uVar94 + uVar95 * 2);
                *(undefined2 *)((long)puVar87 + (2 - uVar94)) =
                     *(undefined2 *)(digit_table + uVar76 * 2);
                iVar69 = (int)uVar77;
                if (iVar69 == 0) {
                  if (iVar61 == 0) {
                    uVar82 = 0;
                    if (uVar76 == 0) {
                      uVar82 = (uint)(byte)dec_trailing_zero_table[uVar95];
                    }
                    uVar76 = 4 - (uVar82 + (byte)dec_trailing_zero_table[uVar76]);
                  }
                  else {
                    uVar76 = (uint)(iVar61 * 0x147b) >> 0x13;
                    uVar82 = uVar76 * -100 + iVar61;
                    *(undefined2 *)((long)puVar87 + (4 - uVar94)) =
                         *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                    *(undefined2 *)((long)puVar87 + (6 - uVar94)) =
                         *(undefined2 *)(digit_table + uVar82 * 2);
                    uVar76 = (byte)dec_trailing_zero_table[uVar76] + 2;
                    if (uVar82 != 0) {
                      uVar76 = (uint)(byte)dec_trailing_zero_table[uVar82];
                    }
                    uVar76 = 8 - uVar76;
                  }
                }
                else {
                  uVar95 = (uint)(iVar61 * 0x147b) >> 0x13;
                  uVar76 = (uint)((uVar77 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar91 = uVar76 >> 8;
                  uVar82 = uVar91 * 0x147b >> 0x13;
                  uVar77 = (ulong)uVar82;
                  uVar82 = uVar82 * -100 + (uVar76 >> 8);
                  *(undefined2 *)((long)puVar87 + (4 - uVar94)) =
                       *(undefined2 *)(digit_table + (ulong)uVar95 * 2);
                  *(undefined2 *)((long)puVar87 + (6 - uVar94)) =
                       *(undefined2 *)(digit_table + (uVar95 * 0x7fffff9c + iVar61) * 2);
                  *(undefined2 *)((long)puVar87 + (8 - uVar94)) =
                       *(undefined2 *)(digit_table + uVar77 * 2);
                  *(undefined2 *)((long)puVar87 + (10 - uVar94)) =
                       *(undefined2 *)(digit_table + uVar82 * 2);
                  iVar69 = uVar91 * -10000 + iVar69;
                  if (iVar69 == 0) {
                    iVar69 = 0xc;
                  }
                  else {
                    uVar76 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar77 = (ulong)uVar76;
                    uVar82 = uVar76 * -100 + iVar69;
                    *(undefined2 *)((long)puVar87 + (0xc - uVar94)) =
                         *(undefined2 *)(digit_table + uVar77 * 2);
                    *(undefined2 *)((long)puVar87 + (0xe - uVar94)) =
                         *(undefined2 *)(digit_table + uVar82 * 2);
                    iVar69 = 0x10;
                  }
                  uVar76 = (byte)dec_trailing_zero_table[uVar77] + 2;
                  if (uVar82 != 0) {
                    uVar76 = (uint)(byte)dec_trailing_zero_table[uVar82];
                  }
                  uVar76 = iVar69 - uVar76;
                }
                local_70 = (uint *)((long)puVar87 + (uVar76 - uVar94));
                *(undefined2 *)puVar70 = 0x2e30;
                if ((int)uVar68 < 0) {
                  sVar72 = 1;
                  if (1 < (int)-uVar68) {
                    sVar72 = (size_t)-uVar68;
                  }
                  switchD_00570541::default((undefined2 *)((long)puVar70 + 2),0x30,sVar72);
                }
              }
              else {
                uVar94 = uVar77 / 100000000;
                uVar82 = (uint)uVar94;
                puVar87 = (undefined2 *)((long)puVar70 + (2 - (ulong)(uVar82 < 100000000)));
                iVar90 = (int)((uVar94 & 0xffffffff) / 10000);
                iVar61 = iVar90 * -10000 + uVar82;
                uVar77 = uVar94 * 0xfa0a1f00 + uVar77;
                iVar69 = (int)(((uVar94 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                uVar91 = (uint)(iVar69 * 0x29) >> 0xc;
                uVar95 = uVar91 * -100 + iVar69;
                uVar76 = iVar69 * -100 + iVar90;
                *puVar70 = 0x3030303030303030;
                puVar70[1] = 0x3030303030303030;
                puVar70[2] = 0x3030303030303030;
                *(char *)((long)puVar70 + 1) = (char)uVar91 + '0';
                uVar94 = (ulong)(uVar95 < 10 && uVar82 < 100000000);
                *puVar87 = *(undefined2 *)(digit_table + uVar94 + uVar95 * 2);
                *(undefined2 *)((long)puVar87 + (2 - uVar94)) =
                     *(undefined2 *)(digit_table + uVar76 * 2);
                iVar69 = (int)uVar77;
                if (iVar69 == 0) {
                  if (iVar61 == 0) {
                    uVar82 = 0;
                    if (uVar76 == 0) {
                      uVar82 = (uint)(byte)dec_trailing_zero_table[uVar95];
                    }
                    uVar76 = 4 - (uVar82 + (byte)dec_trailing_zero_table[uVar76]);
                  }
                  else {
                    uVar76 = (uint)(iVar61 * 0x147b) >> 0x13;
                    uVar82 = uVar76 * -100 + iVar61;
                    *(undefined2 *)((long)puVar87 + (4 - uVar94)) =
                         *(undefined2 *)(digit_table + (ulong)uVar76 * 2);
                    *(undefined2 *)((long)puVar87 + (6 - uVar94)) =
                         *(undefined2 *)(digit_table + uVar82 * 2);
                    uVar76 = (byte)dec_trailing_zero_table[uVar76] + 2;
                    if (uVar82 != 0) {
                      uVar76 = (uint)(byte)dec_trailing_zero_table[uVar82];
                    }
                    uVar76 = 8 - uVar76;
                  }
                }
                else {
                  uVar91 = (uint)(iVar61 * 0x147b) >> 0x13;
                  uVar76 = (uint)((uVar77 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar95 = uVar76 >> 8;
                  uVar82 = uVar95 * 0x147b >> 0x13;
                  uVar77 = (ulong)uVar82;
                  uVar82 = uVar82 * -100 + (uVar76 >> 8);
                  *(undefined2 *)((long)puVar87 + (4 - uVar94)) =
                       *(undefined2 *)(digit_table + (ulong)uVar91 * 2);
                  *(undefined2 *)((long)puVar87 + (6 - uVar94)) =
                       *(undefined2 *)(digit_table + (uVar91 * 0x7fffff9c + iVar61) * 2);
                  *(undefined2 *)((long)puVar87 + (8 - uVar94)) =
                       *(undefined2 *)(digit_table + uVar77 * 2);
                  *(undefined2 *)((long)puVar87 + (10 - uVar94)) =
                       *(undefined2 *)(digit_table + uVar82 * 2);
                  iVar69 = uVar95 * -10000 + iVar69;
                  if (iVar69 == 0) {
                    iVar69 = 0xc;
                  }
                  else {
                    uVar76 = (uint)(iVar69 * 0x147b) >> 0x13;
                    uVar77 = (ulong)uVar76;
                    uVar82 = uVar76 * -100 + iVar69;
                    *(undefined2 *)((long)puVar87 + (0xc - uVar94)) =
                         *(undefined2 *)(digit_table + uVar77 * 2);
                    *(undefined2 *)((long)puVar87 + (0xe - uVar94)) =
                         *(undefined2 *)(digit_table + uVar82 * 2);
                    iVar69 = 0x10;
                  }
                  uVar76 = (byte)dec_trailing_zero_table[uVar77] + 2;
                  if (uVar82 != 0) {
                    uVar76 = (uint)(byte)dec_trailing_zero_table[uVar82];
                  }
                  uVar76 = iVar69 - uVar76;
                }
                puVar103 = (uint *)((long)puVar87 + (uVar76 - uVar94));
                uVar77 = 1;
                if (1 < (int)uVar68) {
                  uVar77 = (ulong)uVar68;
                }
                uVar94 = 0;
                do {
                  *(byte *)((long)puVar105 + uVar94 + lVar92) =
                       *(byte *)((long)puVar105 + uVar94 + lVar92 + 1);
                  uVar94 = uVar94 + 1;
                } while (uVar77 != uVar94);
                local_70 = (uint *)((undefined1 *)((long)puVar70 + (ulong)uVar68) + 2);
                *(undefined1 *)((long)puVar70 + (ulong)uVar68) = 0x2e;
                if (local_70 < puVar103) {
                  local_70 = puVar103;
                }
              }
            }
            else {
              uVar94 = uVar77 / 100000000;
              uVar68 = (uint)uVar94;
              lVar92 = 2 - (ulong)(uVar68 < 100000000);
              iVar81 = (int)((uVar94 & 0xffffffff) / 10000);
              iVar83 = iVar81 * -10000 + uVar68;
              uVar77 = uVar94 * 0xfa0a1f00 + uVar77;
              iVar90 = (int)(((uVar94 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
              uVar76 = (uint)(iVar90 * 0x29) >> 0xc;
              uVar91 = uVar76 * -100 + iVar90;
              uVar82 = iVar90 * -100 + iVar81;
              *(char *)((long)puVar70 + 1) = (char)uVar76 + '0';
              uVar94 = (ulong)(uVar91 < 10 && uVar68 < 100000000);
              *(undefined2 *)((long)puVar70 + lVar92) =
                   *(undefined2 *)(digit_table + uVar94 + uVar91 * 2);
              lVar92 = lVar92 - uVar94;
              *(undefined2 *)((long)puVar70 + lVar92 + 2) =
                   *(undefined2 *)(digit_table + uVar82 * 2);
              iVar90 = (int)uVar77;
              if (iVar90 == 0) {
                if (iVar83 == 0) {
                  uVar68 = 0;
                  if (uVar82 == 0) {
                    uVar68 = (uint)(byte)dec_trailing_zero_table[uVar91];
                  }
                  uVar68 = uVar68 + (byte)dec_trailing_zero_table[uVar82];
                  iVar90 = 4;
                }
                else {
                  uVar68 = (uint)(iVar83 * 0x147b) >> 0x13;
                  uVar76 = uVar68 * -100 + iVar83;
                  *(undefined2 *)((long)puVar70 + lVar92 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                  *(undefined2 *)((long)puVar70 + lVar92 + 6) =
                       *(undefined2 *)(digit_table + uVar76 * 2);
                  uVar68 = (byte)dec_trailing_zero_table[uVar68] + 2;
                  if (uVar76 != 0) {
                    uVar68 = (uint)(byte)dec_trailing_zero_table[uVar76];
                  }
                  iVar90 = 8;
                }
                uVar68 = iVar90 - uVar68;
              }
              else {
                uVar91 = (uint)(iVar83 * 0x147b) >> 0x13;
                uVar68 = (uint)((uVar77 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar95 = uVar68 >> 8;
                uVar82 = uVar95 * 0x147b >> 0x13;
                uVar76 = uVar82 * -100 + (uVar68 >> 8);
                *(undefined2 *)((long)puVar70 + lVar92 + 4) =
                     *(undefined2 *)(digit_table + (ulong)uVar91 * 2);
                *(undefined2 *)((long)puVar70 + lVar92 + 6) =
                     *(undefined2 *)(digit_table + (uVar91 * 0x7fffff9c + iVar83) * 2);
                *(undefined2 *)((long)puVar70 + lVar92 + 8) =
                     *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                *(undefined2 *)((long)puVar70 + lVar92 + 10) =
                     *(undefined2 *)(digit_table + uVar76 * 2);
                iVar90 = uVar95 * -10000 + iVar90;
                if (iVar90 == 0) {
                  uVar68 = (byte)dec_trailing_zero_table[uVar82] + 2;
                  if (uVar76 != 0) {
                    uVar68 = (uint)(byte)dec_trailing_zero_table[uVar76];
                  }
                  uVar68 = 0xc - uVar68;
                }
                else {
                  uVar68 = (uint)(iVar90 * 0x147b) >> 0x13;
                  uVar76 = uVar68 * -100 + iVar90;
                  *(undefined2 *)((long)puVar70 + lVar92 + 0xc) =
                       *(undefined2 *)(digit_table + (ulong)uVar68 * 2);
                  *(undefined2 *)((long)puVar70 + lVar92 + 0xe) =
                       *(undefined2 *)(digit_table + uVar76 * 2);
                  uVar68 = (byte)dec_trailing_zero_table[uVar68] + 2;
                  if (uVar76 != 0) {
                    uVar68 = (uint)(byte)dec_trailing_zero_table[uVar76];
                  }
                  uVar68 = 0x10 - uVar68;
                }
              }
              puVar87 = (undefined2 *)
                        ((long)puVar70 +
                        (((ulong)uVar68 + lVar92) - (ulong)((ulong)uVar68 + lVar92 == 2)));
              uVar76 = (iVar61 + iVar69) - 1;
              *(undefined1 *)puVar70 = *(undefined1 *)((long)puVar70 + 1);
              *(undefined1 *)((long)puVar70 + 1) = 0x2e;
              *puVar87 = 0x2d65;
              uVar82 = uVar76 >> 0x1f;
              pcVar60 = (char *)((long)puVar87 + (ulong)uVar82 + 1);
              uVar68 = -uVar76;
              if (0 < (int)uVar76) {
                uVar68 = uVar76;
              }
              if (uVar68 < 100) {
                *(undefined2 *)pcVar60 =
                     *(undefined2 *)(digit_table + (ulong)(uVar68 < 10) + (ulong)uVar68 * 2);
                pbVar79 = (byte *)(pcVar60 + -(ulong)(uVar68 < 10));
                goto LAB_0126f442;
              }
              *pcVar60 = (char)(uVar68 * 0x290 >> 0x10) + '0';
              *(undefined2 *)((long)puVar87 + (ulong)uVar82 + 2) =
                   *(undefined2 *)
                    (digit_table + ((uVar68 * 0x290 >> 0x10) * 0x7fffff9c + uVar68) * 2);
              local_70 = (uint *)((long)puVar87 + (ulong)uVar82 + 4);
            }
          }
        }
      }
      if (local_70 != (uint *)0x0) goto LAB_0126d90a;
      (*p_Var5)(pvVar6,puVar105);
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar65 = &local_48;
      if (err != (yyjson_write_err *)0x0) {
        pyVar65 = err;
      }
      pyVar66->code = 4;
      pcVar60 = "nan or inf number is not allowed";
      goto LAB_0126d971;
    case 5:
switchD_012687f5_caseD_5:
      uVar94 = uVar77 >> 8;
      puVar103 = (uint *)(val->uni).str;
      puVar105 = (uint *)(*p_Var4)(pvVar6,uVar94 * 6 + 4);
      if (puVar105 != (uint *)0x0) {
        if ((puVar102 != enc_table_cpy) || ((val->tag & 0x18) == 0)) {
          puVar86 = (uint *)(uVar94 + (long)puVar103);
          *(byte *)puVar105 = 0x22;
          puVar74 = puVar105;
LAB_0126dbc5:
          lVar92 = (long)puVar86 - (long)puVar103;
          if (0xf < lVar92) {
            lVar99 = 0;
            do {
              puVar59 = (uint *)((long)puVar74 + lVar99 + 1);
              puVar106 = (uint *)((long)puVar103 + lVar99);
              if (puVar102[*(byte *)((long)puVar103 + lVar99)] != '\0') goto LAB_0126dfa5;
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 1)] != '\0') {
                puVar59 = (uint *)((long)puVar74 + lVar99 + 1);
                puVar106 = (uint *)((long)puVar103 + lVar99);
                goto LAB_0126ddb1;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 2)] != '\0') {
                puVar59 = (uint *)((long)puVar74 + lVar99 + 1);
                puVar106 = (uint *)((long)puVar103 + lVar99);
                goto LAB_0126ddd2;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 3)] != '\0') {
                puVar59 = (uint *)((long)puVar74 + lVar99 + 1);
                puVar106 = (uint *)((long)puVar103 + lVar99);
                goto LAB_0126ddf7;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 4)] != '\0') {
                puVar106 = (uint *)((byte *)((long)puVar103 + lVar99) + 4);
                puVar59 = (uint *)((long)puVar74 + lVar99 + 5);
                *(undefined4 *)((long)puVar74 + lVar99 + 1) =
                     *(undefined4 *)((long)puVar103 + lVar99);
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 5)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 5);
                puVar59 = (uint *)((long)puVar74 + lVar99 + 6);
                *(byte *)((long)puVar59 + -1) = pbVar79[4];
                *(undefined4 *)((long)puVar59 + -5) = *(undefined4 *)pbVar79;
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 6)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 6);
                puVar59 = (uint *)((long)puVar74 + lVar99 + 7);
                *(ushort *)((long)puVar59 + -2) = *(ushort *)(pbVar79 + 4);
                *(undefined4 *)((long)puVar59 + -6) = *(undefined4 *)pbVar79;
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 7)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 7);
                uVar3 = *(undefined4 *)pbVar79;
                puVar59 = (uint *)((long)puVar74 + lVar99 + 8);
                *(undefined4 *)((long)puVar74 + lVar99 + 4) = *(undefined4 *)(pbVar79 + 3);
                *(undefined4 *)((long)puVar74 + lVar99 + 1) = uVar3;
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 8)] != '\0') {
                puVar106 = (uint *)((byte *)((long)puVar103 + lVar99) + 8);
                puVar59 = (uint *)((long)puVar74 + lVar99 + 9);
                *(undefined8 *)((long)puVar74 + lVar99 + 1) =
                     *(undefined8 *)((long)puVar103 + lVar99);
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 9)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 9);
                puVar59 = (uint *)((long)puVar74 + lVar99 + 10);
                *(byte *)((long)puVar59 + -1) = pbVar79[8];
                *(undefined8 *)((long)puVar59 + -9) = *(undefined8 *)pbVar79;
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 10)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 10);
                puVar59 = (uint *)((long)puVar74 + lVar99 + 0xb);
                *(ushort *)((long)puVar59 + -2) = *(ushort *)(pbVar79 + 8);
                *(undefined8 *)((long)puVar59 + -10) = *(undefined8 *)pbVar79;
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 0xb)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 0xb);
                puVar59 = (uint *)((long)puVar74 + lVar99 + 0xc);
                puVar59[-1] = *(uint *)(pbVar79 + 7);
                *(undefined8 *)((long)puVar59 + -0xb) = *(undefined8 *)pbVar79;
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 0xc)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 0xc);
                puVar59 = (uint *)((long)puVar74 + lVar99 + 0xd);
                puVar59[-1] = *(uint *)(pbVar79 + 8);
                *(undefined8 *)(puVar59 + -3) = *(undefined8 *)pbVar79;
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 0xd)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 0xd);
                uVar71 = *(undefined8 *)pbVar79;
                puVar59 = (uint *)((long)puVar74 + lVar99 + 0xe);
                *(undefined8 *)((long)puVar74 + lVar99 + 6) = *(undefined8 *)(pbVar79 + 5);
                *(undefined8 *)((long)puVar74 + lVar99 + 1) = uVar71;
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 0xe)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 0xe);
                uVar71 = *(undefined8 *)pbVar79;
                puVar59 = (uint *)((long)puVar74 + lVar99 + 0xf);
                *(undefined8 *)((long)puVar74 + lVar99 + 7) = *(undefined8 *)(pbVar79 + 6);
                *(undefined8 *)((long)puVar74 + lVar99 + 1) = uVar71;
                goto LAB_0126dfa5;
              }
              if (puVar102[*(byte *)((long)puVar103 + lVar99 + 0xf)] != '\0') {
                pbVar79 = (byte *)((long)puVar103 + lVar99);
                puVar106 = (uint *)(pbVar79 + 0xf);
                uVar71 = *(undefined8 *)pbVar79;
                puVar59 = (uint *)((long)puVar74 + lVar99 + 0x10);
                *(undefined8 *)((long)puVar74 + lVar99 + 8) = *(undefined8 *)(pbVar79 + 7);
                *(undefined8 *)((long)puVar74 + lVar99 + 1) = uVar71;
                goto LAB_0126dfa5;
              }
              uVar68 = puVar106[1];
              uVar76 = puVar106[2];
              uVar82 = puVar106[3];
              *puVar59 = *puVar106;
              *(uint *)((long)puVar74 + lVar99 + 5) = uVar68;
              *(uint *)((long)puVar74 + lVar99 + 9) = uVar76;
              *(uint *)((long)puVar74 + lVar99 + 0xd) = uVar82;
              lVar99 = lVar99 + 0x10;
              lVar92 = lVar92 + -0x10;
            } while (0xf < lVar92);
            puVar74 = (uint *)((long)puVar74 + lVar99);
            puVar103 = (uint *)((long)puVar103 + lVar99);
          }
          puVar59 = (uint *)((long)puVar74 + 1);
          puVar106 = puVar103;
          for (lVar92 = (long)puVar86 - (long)puVar103; 3 < lVar92; lVar92 = lVar92 + -4) {
            if (puVar102[(byte)*puVar106] != '\0') goto LAB_0126dfa5;
            if (puVar102[*(byte *)((long)puVar106 + 1)] != '\0') goto LAB_0126ddb1;
            if (puVar102[*(byte *)((long)puVar106 + 2)] != '\0') goto LAB_0126ddd2;
            if (puVar102[*(byte *)((long)puVar106 + 3)] != '\0') goto LAB_0126ddf7;
            *puVar59 = *puVar106;
            puVar59 = puVar59 + 1;
            puVar106 = puVar106 + 1;
          }
          while( true ) {
            if (puVar86 <= puVar106) goto switchD_0126dfcf_default;
            uVar68 = *puVar106;
            if (puVar102[(byte)uVar68] != '\0') break;
            puVar106 = (uint *)((long)puVar106 + 1);
            *(byte *)puVar59 = (byte)uVar68;
            puVar59 = (uint *)((long)puVar59 + 1);
          }
          goto LAB_0126dfa5;
        }
        puVar74 = (uint *)((long)puVar105 + 1);
        *(byte *)puVar105 = 0x22;
        if (0xfff < uVar77) {
          do {
            uVar71 = *(undefined8 *)(puVar103 + 2);
            *(undefined8 *)puVar74 = *(undefined8 *)puVar103;
            *(undefined8 *)(puVar74 + 2) = uVar71;
            puVar74 = puVar74 + 4;
            puVar103 = puVar103 + 4;
            uVar94 = uVar94 - 0x10;
          } while (0xf < uVar94);
        }
        for (; 3 < uVar94; uVar94 = uVar94 - 4) {
          *puVar74 = *puVar103;
          puVar74 = puVar74 + 1;
          puVar103 = puVar103 + 1;
        }
        if (uVar94 != 0) {
          uVar77 = 0;
          do {
            *(byte *)((long)puVar74 + uVar77) = *(byte *)((long)puVar103 + uVar77);
            uVar77 = uVar77 + 1;
          } while (uVar94 != uVar77);
          puVar74 = (uint *)((long)puVar74 + uVar77);
        }
        *(byte *)puVar74 = 0x22;
        local_70 = (uint *)((long)puVar74 + 1);
        goto LAB_0126d90a;
      }
      break;
    case 6:
switchD_012687f5_caseD_6:
      puVar105 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar105 != (uint *)0x0) {
        *(ushort *)puVar105 = 0x5d5b;
LAB_0126d8fb:
        local_70 = (uint *)((long)puVar105 + 2);
        goto LAB_0126d90a;
      }
      break;
    case 7:
switchD_012687f5_caseD_7:
      puVar105 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar105 != (uint *)0x0) {
        *(ushort *)puVar105 = 0x7d7b;
        goto LAB_0126d8fb;
      }
    }
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar65 = &local_48;
    if (err != (yyjson_write_err *)0x0) {
      pyVar65 = err;
    }
    pyVar66->code = 2;
    pcVar60 = "memory allocation failed";
    goto LAB_0126d971;
  }
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar65 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar65 = err;
  }
  pyVar65->msg = "input JSON is NULL";
  pyVar66->code = 1;
  goto LAB_0126d975;
LAB_0126b755:
  *(byte *)puVar59 = (byte)*puVar106;
  puVar59 = (uint *)((long)puVar59 + 1);
  puVar106 = (uint *)((long)puVar106 + 1);
  goto LAB_0126b927;
LAB_0126b771:
  *(ushort *)puVar59 = (ushort)*puVar106;
  puVar59 = (uint *)((long)puVar59 + 2);
  puVar106 = (uint *)((long)puVar106 + 2);
  goto LAB_0126b927;
LAB_0126b791:
  *(byte *)((long)puVar59 + 2) = *(byte *)((long)puVar106 + 2);
  *(ushort *)puVar59 = (ushort)*puVar106;
  puVar59 = (uint *)((long)puVar59 + 3);
  puVar106 = (uint *)((long)puVar106 + 3);
LAB_0126b927:
  puVar105 = puVar106 + 1;
  if (puVar105 <= puVar86) {
LAB_0126b934:
    bVar101 = (byte)*puVar106;
    switch(puVar102[bVar101]) {
    case 0:
      goto switchD_0126b94e_caseD_0;
    case 1:
      goto switchD_0126b94e_caseD_1;
    case 2:
      *(ushort *)puVar59 = *(ushort *)(esc_single_char_table + (ulong)bVar101 * 2);
      puVar59 = (uint *)((long)puVar59 + 2);
      puVar106 = (uint *)((long)puVar106 + 1);
      goto LAB_0126b927;
    case 3:
      *puVar59 = 0x3030755c;
      *(ushort *)(puVar59 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar106 * 2);
      goto LAB_0126bb91;
    case 4:
      uVar2 = (ushort)*puVar106;
      if ((uVar2 & 0x1e) != 0 && (uVar2 & 0xc0e0) == 0x80c0) {
        *(ushort *)puVar59 = uVar2;
        puVar59 = (uint *)((long)puVar59 + 2);
        puVar106 = (uint *)((long)puVar106 + 2);
        goto LAB_0126b927;
      }
      break;
    case 5:
      yyjson_mut_write_opts_impl();
      uVar94 = extraout_RAX_01;
      goto LAB_0126bbdb;
    case 6:
      if (puVar86 < puVar105) {
        uVar68 = (uint)(ushort)*puVar106;
        uVar76 = (uint)(uint3)*puVar106;
        if (((uint3)*puVar106 & 0xc0c0f0) != 0x8080e0) goto LAB_0126bc4e;
LAB_0126bb37:
        bVar109 = false;
        if (((uVar68 & 0x200f) != 0) && ((uVar68 & 0x200f) != 0x200d)) {
          *puVar59 = uVar76;
          puVar59 = (uint *)((long)puVar59 + 3);
          puVar106 = (uint *)((long)puVar106 + 3);
          bVar109 = true;
        }
      }
      else {
        uVar68 = *puVar106;
        uVar76 = uVar68;
        if ((uVar68 & 0xc0c0f0) == 0x8080e0) goto LAB_0126bb37;
LAB_0126bc4e:
        bVar109 = false;
      }
      if (bVar109) goto LAB_0126b927;
      break;
    case 7:
      yyjson_mut_write_opts_impl();
      uVar94 = extraout_RAX_02;
LAB_0126bbdb:
      puVar106 = local_58;
      puVar59 = local_70;
      if ((uVar94 & 1) == 0) goto LAB_0126ba5a;
      goto LAB_0126b927;
    case 8:
      uVar68 = *puVar106;
      bVar109 = false;
      if (((uVar68 & 0xc0c0c0f8) == 0x808080f0) && ((uVar68 & 0x3007) != 0)) {
        if (((byte)uVar68 >> 2 & (uVar68 & 0x3003) != 0) == 0) {
          *puVar59 = uVar68;
          puVar59 = puVar59 + 1;
          bVar109 = true;
          puVar106 = puVar105;
        }
        else {
          bVar109 = false;
        }
      }
      if (bVar109) goto LAB_0126b927;
      break;
    case 9:
      goto switchD_0126b94e_caseD_9;
    default:
      goto switchD_0126b94e_default;
    }
LAB_0126bb5c:
    if ((flg & 0x20) == 0) goto LAB_0126c68c;
    *(byte *)puVar59 = (byte)*puVar106;
    puVar106 = (uint *)((long)puVar106 + 1);
    puVar59 = (uint *)((long)puVar59 + 1);
    goto LAB_0126b927;
  }
  if (puVar86 != puVar106) {
    if ((long)(ulong)((byte)puVar102[(byte)*puVar106] >> 1) <= (long)puVar86 - (long)puVar106)
    goto LAB_0126b934;
switchD_0126b94e_caseD_1:
    if ((flg & 2) == 0) goto LAB_0126bb5c;
    goto LAB_0126ba5a;
  }
switchD_0126b94e_default:
  *(byte *)puVar59 = 0x22;
  pbVar79 = (byte *)((long)puVar59 + 1);
LAB_0126cb5a:
  if (pbVar79 == (byte *)0x0) goto LAB_0126d601;
LAB_0126cb68:
  bVar101 = 0x3a;
  if ((~(uint)lVar92 & (uint)uVar77) == 0) {
    bVar101 = 0x2c;
  }
  *pbVar79 = bVar101;
  puVar74 = (uint *)(pbVar79 + 1);
  sVar107 = uVar64;
  puVar86 = puVar103;
LAB_0126cb85:
  lVar92 = lVar92 + -1;
  if (lVar92 == 0) goto LAB_0126d44d;
  goto LAB_0126b153;
switchD_0126b94e_caseD_9:
  uVar68 = *puVar106;
  bVar109 = false;
  if (((uVar68 & 0xc0c0c0f8) == 0x808080f0) && ((uVar68 & 0x3007) != 0)) {
    if (((byte)uVar68 >> 2 & (uVar68 & 0x3003) != 0) == 0) {
      bVar101 = *(byte *)((long)puVar106 + 2);
      uVar68 = (bVar101 & 0x3f) * 0x40;
      bVar1 = *(byte *)((long)puVar106 + 3);
      uVar76 = (uVar68 + ((*(byte *)((long)puVar106 + 1) & 0x3f) << 0xc |
                         ((byte)*puVar106 & 7) << 0x12)) - 0x10000;
      *(ushort *)puVar59 = 0x755c;
      *(ushort *)((long)puVar59 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)((uVar76 >> 10) + 0xd800 >> 8) * 2);
      *(ushort *)(puVar59 + 1) = *(ushort *)(esc_hex_char_table + (uVar76 >> 9 & 0x1fe));
      *(ushort *)((long)puVar59 + 6) = 0x755c;
      *(ushort *)(puVar59 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(bVar101 >> 1 & 6) + 0x1b8)
      ;
      *(ushort *)((long)puVar59 + 10) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar68 & 0xff | bVar1 & 0x3f) * 2);
      puVar59 = puVar59 + 3;
      bVar109 = true;
      puVar106 = puVar105;
    }
    else {
      bVar109 = false;
    }
  }
  if (!bVar109) {
LAB_0126ba5a:
    if ((flg & 0x20) == 0) {
LAB_0126c68c:
      pbVar79 = (byte *)0x0;
      goto LAB_0126cb5a;
    }
    *(ushort *)puVar59 = 0x755c;
    ((ushort *)((long)puVar59 + 2))[0] = 0x4646;
    ((ushort *)((long)puVar59 + 2))[1] = 0x4446;
LAB_0126bb91:
    puVar106 = (uint *)((long)puVar106 + 1);
    puVar59 = (uint *)((long)puVar59 + 6);
  }
  goto LAB_0126b927;
switchD_0126b94e_caseD_0:
  puVar105 = (uint *)((long)puVar106 + 1);
  *(byte *)puVar59 = bVar101;
  puVar74 = puVar59;
  goto LAB_0126b592;
LAB_0126d44d:
  pbVar79 = local_f8 + ~(ulong)puVar74;
  lVar99 = 0;
  pyVar84 = val;
  do {
    local_80 = pyVar84;
    *(byte *)((long)puVar74 + -1) = (char)local_e0 * ' ' + 0x5d;
    puVar103 = (uint *)((long)puVar74 + 1);
    *(byte *)puVar74 = 0x2c;
    if (local_90 <= (uint *)((long)puVar86 + lVar99)) {
      if (local_ec < '\0') {
        if ((uint *)((long)puVar86 + lVar99) <= (uint *)((long)puVar74 + 3)) {
          uVar77 = 2;
          if (2 < sVar107 >> 1) {
            uVar77 = sVar107 >> 1;
          }
          uVar77 = uVar77 + 0xf & 0xfffffffffffffff0;
          pbVar100 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar107,uVar77 + sVar107);
          if (pbVar100 == (byte *)0x0) goto LAB_0126d569;
          memmove(pbVar100 + (long)((long)puVar86 + lVar99 + ((uVar77 + sVar107) - (long)local_90)),
                  (byte *)((long)puVar86 + (lVar99 - (long)local_f8)) + (long)pbVar100,
                  (size_t)((long)local_90 + (-lVar99 - (long)puVar86)));
          puVar103 = (uint *)(pbVar100 + -(long)pbVar79);
          local_f8 = pbVar100;
        }
        *(byte *)((long)puVar103 + -1) = 10;
        puVar74 = puVar103;
      }
      *(byte *)puVar74 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)puVar74 - (long)local_f8;
      }
      goto LAB_0126f53a;
    }
    puVar88 = (ulong *)((long)puVar86 + lVar99);
    val = *(yyjson_mut_val **)((long)puVar86 + lVar99 + 8);
    local_e0 = *puVar88 & 0xffffffffffffff01;
    lVar99 = lVar99 + 0x10;
    pbVar79 = pbVar79 + -1;
    lVar92 = (*puVar88 >> 1) - 1;
    puVar74 = puVar103;
    pyVar84 = val;
  } while (lVar92 == 0);
  puVar105 = (uint *)((long)puVar86 + lVar99);
  goto LAB_0126b134;
LAB_01269024:
  *(byte *)puVar106 = (byte)*puVar86;
  puVar106 = (uint *)((long)puVar106 + 1);
  puVar86 = (uint *)((long)puVar86 + 1);
  goto LAB_01269261;
LAB_0126904b:
  *(ushort *)puVar106 = (ushort)*puVar86;
  puVar106 = (uint *)((long)puVar106 + 2);
  puVar86 = (uint *)((long)puVar86 + 2);
  goto LAB_01269261;
LAB_01269076:
  *(byte *)((long)puVar106 + 2) = *(byte *)((long)puVar86 + 2);
  *(ushort *)puVar106 = (ushort)*puVar86;
  puVar106 = (uint *)((long)puVar106 + 3);
  puVar86 = (uint *)((long)puVar86 + 3);
LAB_01269261:
  puVar105 = puVar86 + 1;
  if (puVar105 <= puVar74) {
LAB_0126926e:
    bVar101 = (byte)*puVar86;
    switch(puVar98[bVar101]) {
    case 0:
      goto switchD_01269289_caseD_0;
    case 1:
      goto switchD_01269289_caseD_1;
    case 2:
      *(ushort *)puVar106 = *(ushort *)(esc_single_char_table + (ulong)bVar101 * 2);
      puVar106 = (uint *)((long)puVar106 + 2);
      puVar86 = (uint *)((long)puVar86 + 1);
      goto LAB_01269261;
    case 3:
      *puVar106 = 0x3030755c;
      *(ushort *)(puVar106 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar86 * 2);
      goto LAB_012694ce;
    case 4:
      uVar2 = (ushort)*puVar86;
      if ((uVar2 & 0x1e) != 0 && (uVar2 & 0xc0e0) == 0x80c0) {
        *(ushort *)puVar106 = uVar2;
        puVar106 = (uint *)((long)puVar106 + 2);
        puVar86 = (uint *)((long)puVar86 + 2);
        goto LAB_01269261;
      }
      break;
    case 5:
      yyjson_mut_write_opts_impl();
      uVar77 = extraout_RAX;
      goto LAB_0126950c;
    case 6:
      if (puVar74 < puVar105) {
        uVar76 = (uint)(uint3)*puVar86;
        uVar82 = (uint)(ushort)*puVar86;
        if ((uVar76 & 0xc0c0f0) != 0x8080e0) goto LAB_0126957b;
LAB_01269479:
        bVar109 = false;
        if (((uVar82 & 0x200f) != 0) && ((uVar82 & 0x200f) != 0x200d)) {
          *puVar106 = uVar76;
          puVar106 = (uint *)((long)puVar106 + 3);
          puVar86 = (uint *)((long)puVar86 + 3);
          bVar109 = true;
        }
      }
      else {
        uVar76 = *puVar86;
        uVar82 = uVar76;
        if ((uVar76 & 0xc0c0f0) == 0x8080e0) goto LAB_01269479;
LAB_0126957b:
        bVar109 = false;
      }
      if (bVar109) goto LAB_01269261;
      break;
    case 7:
      yyjson_mut_write_opts_impl();
      uVar77 = extraout_RAX_00;
LAB_0126950c:
      puVar106 = local_70;
      puVar86 = local_58;
      if ((uVar77 & 1) == 0) goto LAB_0126939d;
      goto LAB_01269261;
    case 8:
      uVar76 = *puVar86;
      bVar109 = false;
      if (((uVar76 & 0xc0c0c0f8) == 0x808080f0) && ((uVar76 & 0x3007) != 0)) {
        if (((byte)uVar76 >> 2 & (uVar76 & 0x3003) != 0) == 0) {
          *puVar106 = uVar76;
          puVar106 = puVar106 + 1;
          bVar109 = true;
          puVar86 = puVar105;
        }
        else {
          bVar109 = false;
        }
      }
      if (bVar109) goto LAB_01269261;
      break;
    case 9:
      goto switchD_01269289_caseD_9;
    default:
      goto switchD_01269289_default;
    }
LAB_0126949d:
    if ((flg & 0x20) == 0) goto LAB_0126a031;
    *(byte *)puVar106 = (byte)*puVar86;
    puVar106 = (uint *)((long)puVar106 + 1);
    puVar86 = (uint *)((long)puVar86 + 1);
    goto LAB_01269261;
  }
  if (puVar74 != puVar86) {
    if ((long)(ulong)((byte)puVar98[(byte)*puVar86] >> 1) <= (long)puVar74 - (long)puVar86)
    goto LAB_0126926e;
switchD_01269289_caseD_1:
    if ((flg & 2) == 0) goto LAB_0126949d;
    goto LAB_0126939d;
  }
switchD_01269289_default:
  *(byte *)puVar106 = 0x22;
  pbVar79 = (byte *)((long)puVar106 + 1);
LAB_0126a501:
  if (pbVar79 == (byte *)0x0) goto LAB_0126d601;
LAB_0126a50f:
  bVar109 = (local_c0 & ~uVar68) == 0;
  bVar101 = 0x3a;
  if (bVar109) {
    bVar101 = 0x2c;
  }
  *pbVar79 = bVar101;
  bVar101 = 0x20;
  if (bVar109) {
    bVar101 = 10;
  }
  pbVar79[1] = bVar101;
  puVar105 = (uint *)(pbVar79 + 2);
LAB_0126a93a:
  lVar92 = lVar92 + -1;
  lVar62 = lVar78;
  if (lVar92 == 0) goto LAB_0126aec2;
  pyVar85 = pyVar85->next;
  sVar107 = sVar63;
  puVar89 = puVar88;
  goto LAB_0126891e;
switchD_01269289_caseD_9:
  uVar76 = *puVar86;
  bVar109 = false;
  if (((uVar76 & 0xc0c0c0f8) == 0x808080f0) && ((uVar76 & 0x3007) != 0)) {
    if (((byte)uVar76 >> 2 & (uVar76 & 0x3003) != 0) == 0) {
      bVar101 = *(byte *)((long)puVar86 + 2);
      uVar76 = (bVar101 & 0x3f) * 0x40;
      bVar1 = *(byte *)((long)puVar86 + 3);
      uVar82 = (uVar76 + ((*(byte *)((long)puVar86 + 1) & 0x3f) << 0xc |
                         ((byte)*puVar86 & 7) << 0x12)) - 0x10000;
      *(ushort *)puVar106 = 0x755c;
      *(ushort *)((long)puVar106 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)((uVar82 >> 10) + 0xd800 >> 8) * 2);
      *(ushort *)(puVar106 + 1) = *(ushort *)(esc_hex_char_table + (uVar82 >> 9 & 0x1fe));
      *(ushort *)((long)puVar106 + 6) = 0x755c;
      *(ushort *)(puVar106 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)(bVar101 >> 1 & 6) + 0x1b8);
      *(ushort *)((long)puVar106 + 10) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar76 & 0xff | bVar1 & 0x3f) * 2);
      puVar106 = puVar106 + 3;
      bVar109 = true;
      puVar86 = puVar105;
    }
    else {
      bVar109 = false;
    }
  }
  if (!bVar109) {
LAB_0126939d:
    if ((flg & 0x20) == 0) {
LAB_0126a031:
      pbVar79 = (byte *)0x0;
      goto LAB_0126a501;
    }
    *(ushort *)puVar106 = 0x755c;
    ((ushort *)((long)puVar106 + 2))[0] = 0x4646;
    ((ushort *)((long)puVar106 + 2))[1] = 0x4446;
LAB_012694ce:
    puVar106 = (uint *)((long)puVar106 + 6);
    puVar86 = (uint *)((long)puVar86 + 1);
  }
  goto LAB_01269261;
switchD_01269289_caseD_0:
  puVar103 = (uint *)((long)puVar86 + 1);
  *(byte *)puVar106 = bVar101;
  puVar105 = puVar106;
  goto LAB_01268e10;
LAB_0126d601:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar65 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar65 = err;
  }
  pyVar66->code = 7;
  pcVar60 = "invalid utf-8 encoding in string";
LAB_0126d4f8:
  pyVar65->msg = pcVar60;
  if (local_f8 != (byte *)0x0) {
    (*p_Var5)(pvVar6,local_f8);
  }
  goto LAB_0126d975;
LAB_0126d4be:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar65 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar65 = err;
  }
  pyVar66->code = 3;
  pcVar60 = "invalid JSON value type";
  goto LAB_0126d4f8;
  while( true ) {
    pyVar84 = local_80->next;
    puVar88 = puVar89 + 2;
    uVar94 = *puVar89;
    local_80 = (yyjson_mut_val *)puVar89[1];
    local_90 = (uint *)(uVar94 & 0xffffffffffffff01);
    puVar105 = (uint *)(pbVar79 + 3);
    pbVar79[1] = 0x2c;
    pbVar79[2] = 10;
    lVar92 = (uVar94 >> 1) - 1;
    lVar62 = lVar78;
    sVar63 = uVar77;
    if (lVar92 != 0) break;
LAB_0126aec2:
    pbVar79 = (byte *)((long)puVar105 + -1);
    *(byte *)((long)puVar105 + -2) = 10;
    uVar77 = sVar63;
    puVar89 = puVar88;
    if (puVar88 <= (ulong *)((long)puVar105 + lVar62 * 4 + -1)) {
      uVar77 = sVar63 >> 1;
      if (sVar63 >> 1 <= (ulong)(lVar62 * 4)) {
        uVar77 = lVar62 * 4;
      }
      uVar77 = (uVar77 + 0xf & 0xfffffffffffffff0) + sVar63;
      pbVar100 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar63,uVar77);
      if (pbVar100 == (byte *)0x0) goto LAB_0126d51f;
      puVar89 = (ulong *)(pbVar100 + (uVar77 - ((long)local_88 - (long)puVar88)));
      memmove(puVar89,pbVar100 + ((long)puVar88 - (long)local_f8),(long)local_88 - (long)puVar88);
      pbVar79 = pbVar100 + ((long)pbVar79 - (long)local_f8);
      local_88 = (ulong *)(pbVar100 + uVar77);
      local_f8 = pbVar100;
    }
    lVar78 = lVar62 + -1;
    if (lVar78 != 0) {
      lVar92 = 1;
      do {
        pbVar79[0] = 0x20;
        pbVar79[1] = 0x20;
        pbVar79[2] = 0x20;
        pbVar79[3] = 0x20;
        pbVar79 = pbVar79 + lVar99;
        lVar92 = lVar92 + 1;
      } while (lVar62 != lVar92);
    }
    *pbVar79 = (char)local_90 * ' ' + 0x5d;
    if (local_88 <= puVar89) {
      pbVar100 = pbVar79 + 1;
      if (local_ec < '\0') {
        if (puVar89 <= pbVar79 + 3) {
          uVar94 = 2;
          if (2 < uVar77 >> 1) {
            uVar94 = uVar77 >> 1;
          }
          sVar107 = (uVar94 + 0xf & 0xfffffffffffffff0) + uVar77;
          pbVar79 = (byte *)(*p_Var7)(pvVar6,local_f8,uVar77,sVar107);
          if (pbVar79 == (byte *)0x0) goto LAB_0126d51f;
          memmove(pbVar79 + (sVar107 - ((long)local_88 - (long)puVar89)),
                  pbVar79 + ((long)puVar89 - (long)local_f8),(long)local_88 - (long)puVar89);
          pbVar100 = pbVar79 + ((long)pbVar100 - (long)local_f8);
          local_f8 = pbVar79;
        }
        *pbVar100 = 10;
        pbVar100 = pbVar100 + 1;
      }
      *pbVar100 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar100 - (long)local_f8;
      }
LAB_0126f53a:
      pyVar66->code = 0;
      pyVar66 = &local_48;
      if (err != (yyjson_write_err *)0x0) {
        pyVar66 = err;
      }
      pyVar66->msg = "success";
      return (char *)local_f8;
    }
  }
  goto LAB_012688f2;
LAB_0126ddb1:
  *(byte *)puVar59 = (byte)*puVar106;
  puVar59 = (uint *)((long)puVar59 + 1);
  puVar106 = (uint *)((long)puVar106 + 1);
  goto LAB_0126dfa5;
LAB_0126ddd2:
  *(ushort *)puVar59 = (ushort)*puVar106;
  puVar59 = (uint *)((long)puVar59 + 2);
  puVar106 = (uint *)((long)puVar106 + 2);
  goto LAB_0126dfa5;
switchD_0126dfcf_caseD_9:
  uVar68 = *puVar106;
  bVar109 = false;
  if (((uVar68 & 0xc0c0c0f8) == 0x808080f0) && ((uVar68 & 0x3007) != 0)) {
    if (((byte)uVar68 >> 2 & (uVar68 & 0x3003) != 0) == 0) {
      bVar101 = *(byte *)((long)puVar106 + 2);
      uVar68 = (bVar101 & 0x3f) * 0x40;
      bVar1 = *(byte *)((long)puVar106 + 3);
      uVar76 = (uVar68 + ((*(byte *)((long)puVar106 + 1) & 0x3f) << 0xc |
                         ((byte)*puVar106 & 7) << 0x12)) - 0x10000;
      *(ushort *)puVar59 = 0x755c;
      *(ushort *)((long)puVar59 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)((uVar76 >> 10) + 0xd800 >> 8) * 2);
      *(ushort *)(puVar59 + 1) = *(ushort *)(esc_hex_char_table + (uVar76 >> 9 & 0x1fe));
      *(ushort *)((long)puVar59 + 6) = 0x755c;
      *(ushort *)(puVar59 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(bVar101 >> 1 & 6) + 0x1b8)
      ;
      *(ushort *)((long)puVar59 + 10) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar68 & 0xff | bVar1 & 0x3f) * 2);
      puVar59 = puVar59 + 3;
      bVar109 = true;
      puVar106 = puVar103;
    }
    else {
      bVar109 = false;
    }
  }
  if (!bVar109) {
LAB_0126e0cf:
    if ((flg & 0x20) == 0) {
LAB_0126ec15:
      local_70 = (uint *)0x0;
      goto LAB_0126f074;
    }
    *(ushort *)puVar59 = 0x755c;
    ((ushort *)((long)puVar59 + 2))[0] = 0x4646;
    ((ushort *)((long)puVar59 + 2))[1] = 0x4446;
LAB_0126e1f4:
    puVar59 = (uint *)((long)puVar59 + 6);
    puVar106 = (uint *)((long)puVar106 + 1);
  }
  goto LAB_0126dfa5;
switchD_0126dfcf_caseD_0:
  puVar103 = (uint *)((long)puVar106 + 1);
  *(byte *)puVar59 = bVar101;
  puVar74 = puVar59;
  goto LAB_0126dbc5;
LAB_0126ddf7:
  *(byte *)((long)puVar59 + 2) = *(byte *)((long)puVar106 + 2);
  *(ushort *)puVar59 = (ushort)*puVar106;
  puVar59 = (uint *)((long)puVar59 + 3);
  puVar106 = (uint *)((long)puVar106 + 3);
LAB_0126dfa5:
  puVar103 = puVar106 + 1;
  if (puVar103 <= puVar86) {
LAB_0126dfb2:
    bVar101 = (byte)*puVar106;
    switch(puVar102[bVar101]) {
    case 0:
      goto switchD_0126dfcf_caseD_0;
    case 1:
      goto switchD_0126dfcf_caseD_1;
    case 2:
      *(ushort *)puVar59 = *(ushort *)(esc_single_char_table + (ulong)bVar101 * 2);
      puVar59 = (uint *)((long)puVar59 + 2);
      puVar106 = (uint *)((long)puVar106 + 1);
      goto LAB_0126dfa5;
    case 3:
      *puVar59 = 0x3030755c;
      *(ushort *)(puVar59 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar106 * 2);
      goto LAB_0126e1f4;
    case 4:
      uVar2 = (ushort)*puVar106;
      if ((uVar2 & 0x1e) != 0 && (uVar2 & 0xc0e0) == 0x80c0) {
        *(ushort *)puVar59 = uVar2;
        puVar59 = (uint *)((long)puVar59 + 2);
        puVar106 = (uint *)((long)puVar106 + 2);
        goto LAB_0126dfa5;
      }
      break;
    case 5:
      yyjson_mut_write_opts_impl();
      uVar77 = extraout_RAX_03;
      goto LAB_0126e232;
    case 6:
      if (puVar86 < puVar103) {
        uVar68 = (uint)(uint3)*puVar106;
        if ((uVar68 & 0xc0c0f0) == 0x8080e0) {
          bVar109 = false;
          if ((*puVar106 & 0x200f) != 0) {
            if ((*puVar106 & 0x200f) != 0x200d) goto LAB_0126e1b5;
            goto LAB_0126e1c1;
          }
        }
        bVar109 = false;
      }
      else {
        uVar68 = *puVar106;
        if ((uVar68 & 0xc0c0f0) == 0x8080e0) {
          bVar109 = false;
          if (((uVar68 & 0x200f) != 0) && ((uVar68 & 0x200f) != 0x200d)) {
LAB_0126e1b5:
            *puVar59 = uVar68;
            puVar59 = (uint *)((long)puVar59 + 3);
            puVar106 = (uint *)((long)puVar106 + 3);
            bVar109 = true;
          }
        }
        else {
          bVar109 = false;
        }
      }
LAB_0126e1c1:
      if (bVar109) goto LAB_0126dfa5;
      break;
    case 7:
      yyjson_mut_write_opts_impl();
      uVar77 = extraout_RAX_04;
LAB_0126e232:
      puVar59 = local_70;
      puVar106 = local_58;
      if ((uVar77 & 1) == 0) goto LAB_0126e0cf;
      goto LAB_0126dfa5;
    case 8:
      uVar68 = *puVar106;
      bVar109 = false;
      if (((uVar68 & 0xc0c0c0f8) == 0x808080f0) && ((uVar68 & 0x3007) != 0)) {
        if (((byte)uVar68 >> 2 & (uVar68 & 0x3003) != 0) == 0) {
          *puVar59 = uVar68;
          puVar59 = puVar59 + 1;
          bVar109 = true;
          puVar106 = puVar103;
        }
        else {
          bVar109 = false;
        }
      }
      if (bVar109) goto LAB_0126dfa5;
      break;
    case 9:
      goto switchD_0126dfcf_caseD_9;
    default:
      goto switchD_0126dfcf_default;
    }
LAB_0126e1c9:
    if ((flg & 0x20) == 0) goto LAB_0126ec15;
    *(byte *)puVar59 = (byte)*puVar106;
    puVar59 = (uint *)((long)puVar59 + 1);
    puVar106 = (uint *)((long)puVar106 + 1);
    goto LAB_0126dfa5;
  }
  if (puVar86 != puVar106) {
    if ((long)(ulong)((byte)puVar102[(byte)*puVar106] >> 1) <= (long)puVar86 - (long)puVar106)
    goto LAB_0126dfb2;
switchD_0126dfcf_caseD_1:
    if ((flg & 2) == 0) goto LAB_0126e1c9;
    goto LAB_0126e0cf;
  }
switchD_0126dfcf_default:
  *(byte *)puVar59 = 0x22;
  local_70 = (uint *)((long)puVar59 + 1);
LAB_0126f074:
  if (local_70 == (uint *)0x0) {
    (*p_Var5)(pvVar6,puVar105);
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar65 = &local_48;
    if (err != (yyjson_write_err *)0x0) {
      pyVar65 = err;
    }
    pyVar66->code = 7;
    pcVar60 = "invalid utf-8 encoding in string";
LAB_0126d971:
    pyVar65->msg = pcVar60;
LAB_0126d975:
    puVar105 = (uint *)0x0;
  }
  else {
LAB_0126d90a:
    if (local_ec < '\0') {
      *(byte *)local_70 = 10;
      local_70 = (uint *)((long)local_70 + 1);
    }
    *(byte *)local_70 = 0;
    if (dat_len != (usize *)0x0) {
      *dat_len = (long)local_70 - (long)puVar105;
    }
    *(undefined8 *)pyVar66 = 0;
    pyVar66->msg = (char *)0x0;
  }
  return (char *)puVar105;
}

Assistant:

static char *yyjson_mut_write_opts_impl(const yyjson_mut_val *val,
                                        usize estimated_val_num,
                                        yyjson_write_flag flg,
                                        const yyjson_alc *alc_ptr,
                                        usize *dat_len,
                                        yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_mut_val *root = constcast(yyjson_mut_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_WRITE_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_mut_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_mut_write_pretty(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_mut_write_minify(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    }
}